

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yuv_sse2.c
# Opt level: O3

void YuvToRgbRow_SSE2(uint8_t *y,uint8_t *u,uint8_t *v,uint8_t *dst,int len)

{
  char cVar1;
  byte bVar7;
  byte bVar15;
  char cVar23;
  byte bVar29;
  byte bVar37;
  byte bVar45;
  byte bVar53;
  byte bVar61;
  byte bVar69;
  char cVar70;
  short sVar71;
  short sVar72;
  short sVar73;
  short sVar74;
  short sVar75;
  short sVar76;
  short sVar77;
  short sVar78;
  short sVar79;
  short sVar80;
  short sVar81;
  short sVar82;
  short sVar83;
  short sVar84;
  short sVar85;
  short sVar86;
  short sVar87;
  short sVar88;
  short sVar89;
  short sVar90;
  short sVar91;
  short sVar92;
  short sVar93;
  short sVar94;
  short sVar95;
  short sVar96;
  short sVar97;
  short sVar98;
  short sVar99;
  short sVar100;
  short sVar101;
  short sVar102;
  undefined1 auVar103 [15];
  undefined1 auVar104 [15];
  undefined1 auVar105 [15];
  undefined1 auVar106 [15];
  undefined1 auVar107 [15];
  undefined1 auVar108 [15];
  undefined1 auVar109 [15];
  undefined1 auVar110 [15];
  undefined1 auVar111 [15];
  undefined1 auVar112 [15];
  undefined1 auVar113 [15];
  undefined1 auVar114 [15];
  undefined1 auVar115 [15];
  undefined1 auVar116 [15];
  undefined1 auVar117 [15];
  undefined1 auVar118 [15];
  undefined1 auVar119 [15];
  undefined1 auVar120 [15];
  undefined1 auVar121 [15];
  undefined1 auVar122 [15];
  undefined1 auVar123 [15];
  undefined1 auVar124 [15];
  undefined1 auVar125 [15];
  undefined1 auVar126 [15];
  undefined1 auVar127 [15];
  undefined1 auVar128 [15];
  undefined1 auVar129 [15];
  undefined1 auVar130 [15];
  undefined1 auVar131 [15];
  undefined1 auVar132 [15];
  undefined1 auVar133 [15];
  undefined1 auVar134 [15];
  undefined1 auVar135 [15];
  undefined1 auVar136 [15];
  undefined1 auVar137 [15];
  undefined1 auVar138 [15];
  undefined1 auVar139 [15];
  undefined1 auVar140 [16];
  undefined1 auVar141 [15];
  undefined1 auVar142 [15];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [15];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [15];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [15];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [15];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [15];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [15];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [15];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [15];
  undefined1 auVar175 [15];
  undefined1 auVar176 [15];
  undefined1 auVar177 [15];
  undefined1 auVar178 [13];
  undefined1 auVar179 [15];
  undefined1 auVar180 [15];
  undefined1 auVar181 [15];
  undefined1 auVar182 [15];
  undefined1 auVar183 [15];
  undefined1 auVar184 [15];
  undefined1 auVar185 [15];
  undefined1 auVar186 [15];
  undefined1 auVar187 [15];
  undefined1 auVar188 [15];
  undefined1 auVar189 [15];
  undefined1 auVar190 [15];
  undefined1 auVar191 [15];
  undefined1 auVar192 [15];
  undefined1 auVar193 [12];
  undefined1 auVar194 [12];
  undefined1 auVar195 [12];
  undefined1 auVar196 [12];
  undefined1 auVar197 [12];
  undefined1 auVar198 [12];
  undefined1 auVar199 [12];
  undefined1 auVar200 [12];
  undefined1 auVar201 [12];
  undefined1 auVar202 [12];
  undefined1 auVar203 [12];
  undefined1 auVar204 [12];
  undefined1 auVar205 [13];
  undefined1 auVar206 [15];
  undefined1 auVar207 [15];
  undefined1 auVar208 [13];
  undefined1 auVar209 [15];
  undefined1 auVar210 [13];
  undefined1 auVar211 [15];
  undefined1 auVar212 [13];
  undefined1 auVar213 [15];
  undefined1 auVar214 [13];
  undefined1 auVar215 [15];
  undefined1 auVar216 [13];
  undefined1 auVar217 [15];
  undefined1 auVar218 [13];
  undefined1 auVar219 [15];
  undefined1 auVar220 [16];
  uint uVar221;
  uint8_t uVar222;
  uint8_t uVar223;
  uint uVar224;
  uint uVar225;
  int iVar226;
  uint uVar227;
  ushort uVar228;
  undefined4 uVar229;
  undefined1 auVar233 [12];
  undefined1 auVar234 [12];
  undefined1 uVar245;
  char cVar246;
  byte bVar248;
  ushort uVar249;
  ushort uVar250;
  ushort uVar251;
  ushort uVar253;
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  ushort uVar247;
  ushort uVar252;
  ushort uVar254;
  undefined1 auVar241 [16];
  undefined4 uVar255;
  undefined1 auVar259 [12];
  undefined1 auVar260 [12];
  undefined1 auVar261 [12];
  undefined1 auVar266 [16];
  undefined4 uVar271;
  undefined1 auVar275 [12];
  undefined1 auVar276 [12];
  undefined1 auVar277 [12];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined4 uVar290;
  char cVar299;
  undefined1 in_XMM4 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  byte bVar300;
  undefined1 auVar297 [16];
  undefined1 auVar301 [16];
  ushort uVar302;
  undefined4 uVar303;
  undefined1 auVar306 [12];
  ushort uVar317;
  ushort uVar318;
  ushort uVar319;
  ushort uVar320;
  ushort uVar321;
  ushort uVar322;
  undefined1 auVar310 [16];
  undefined1 auVar311 [16];
  undefined1 auVar312 [16];
  undefined1 auVar313 [16];
  undefined1 auVar314 [16];
  ushort uVar323;
  ushort uVar324;
  ushort uVar325;
  undefined4 uVar326;
  ushort uVar344;
  ushort uVar352;
  undefined1 auVar329 [12];
  undefined1 auVar330 [12];
  undefined1 auVar332 [12];
  ushort uVar345;
  ushort uVar346;
  ushort uVar347;
  ushort uVar348;
  ushort uVar349;
  ushort uVar350;
  ushort uVar351;
  ushort uVar353;
  ushort uVar354;
  ushort uVar355;
  undefined1 in_XMM11 [16];
  undefined1 auVar337 [16];
  undefined1 auVar338 [16];
  undefined1 auVar339 [16];
  ushort uVar356;
  ushort uVar357;
  ushort uVar358;
  undefined4 uVar359;
  undefined1 auVar362 [12];
  undefined1 auVar364 [12];
  ushort uVar376;
  ushort uVar377;
  ushort uVar378;
  ushort uVar379;
  ushort uVar380;
  ushort uVar381;
  undefined1 auVar368 [16];
  undefined1 auVar369 [16];
  undefined1 auVar370 [16];
  undefined1 auVar371 [16];
  undefined1 auVar372 [16];
  ushort uVar382;
  ushort uVar383;
  undefined4 uVar384;
  undefined1 auVar387 [12];
  undefined1 auVar389 [12];
  undefined1 auVar390 [12];
  ushort uVar402;
  ushort uVar403;
  ushort uVar404;
  ushort uVar405;
  ushort uVar406;
  ushort uVar407;
  undefined1 auVar395 [16];
  undefined1 auVar396 [16];
  undefined1 auVar397 [16];
  ushort uVar408;
  undefined4 uVar409;
  undefined1 auVar413 [12];
  undefined1 auVar414 [12];
  undefined1 auVar418 [16];
  undefined1 auVar419 [16];
  undefined1 auVar420 [16];
  undefined1 auVar421 [16];
  undefined1 auVar422 [16];
  undefined4 uVar426;
  undefined1 auVar429 [12];
  undefined1 auVar433 [16];
  char cVar2;
  char cVar3;
  char cVar4;
  char cVar5;
  char cVar6;
  char cVar8;
  char cVar9;
  char cVar10;
  char cVar11;
  char cVar12;
  char cVar13;
  char cVar14;
  char cVar16;
  char cVar17;
  char cVar18;
  char cVar19;
  char cVar20;
  char cVar21;
  char cVar22;
  char cVar24;
  char cVar25;
  char cVar26;
  char cVar27;
  char cVar28;
  char cVar30;
  char cVar31;
  char cVar32;
  char cVar33;
  char cVar34;
  char cVar35;
  char cVar36;
  char cVar38;
  char cVar39;
  char cVar40;
  char cVar41;
  char cVar42;
  char cVar43;
  char cVar44;
  char cVar46;
  char cVar47;
  char cVar48;
  char cVar49;
  char cVar50;
  char cVar51;
  char cVar52;
  char cVar54;
  char cVar55;
  char cVar56;
  char cVar57;
  char cVar58;
  char cVar59;
  char cVar60;
  char cVar62;
  char cVar63;
  char cVar64;
  char cVar65;
  char cVar66;
  char cVar67;
  char cVar68;
  undefined6 uVar230;
  undefined8 uVar231;
  undefined1 auVar232 [12];
  undefined1 auVar235 [14];
  undefined1 auVar236 [14];
  undefined1 auVar237 [14];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined6 uVar256;
  undefined8 uVar257;
  undefined1 auVar258 [12];
  undefined1 auVar262 [14];
  undefined1 auVar263 [14];
  undefined1 auVar264 [14];
  undefined1 auVar265 [14];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined6 uVar272;
  undefined8 uVar273;
  undefined1 auVar274 [12];
  undefined1 auVar278 [14];
  undefined1 auVar279 [14];
  undefined1 auVar280 [14];
  undefined1 auVar281 [14];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined6 uVar291;
  undefined8 uVar292;
  undefined1 auVar293 [12];
  undefined1 auVar294 [14];
  undefined1 auVar298 [16];
  undefined6 uVar304;
  undefined8 uVar305;
  undefined1 auVar307 [12];
  undefined1 auVar308 [14];
  undefined1 auVar309 [14];
  undefined1 auVar315 [16];
  undefined1 auVar316 [16];
  undefined6 uVar327;
  undefined8 uVar328;
  undefined1 auVar331 [12];
  undefined1 auVar333 [14];
  undefined1 auVar334 [14];
  undefined1 auVar335 [14];
  undefined1 auVar336 [14];
  undefined1 auVar340 [16];
  undefined1 auVar341 [16];
  undefined1 auVar342 [16];
  undefined1 auVar343 [16];
  undefined6 uVar360;
  undefined8 uVar361;
  undefined1 auVar363 [12];
  undefined1 auVar365 [14];
  undefined1 auVar366 [14];
  undefined1 auVar367 [14];
  undefined1 auVar373 [16];
  undefined1 auVar374 [16];
  undefined1 auVar375 [16];
  undefined6 uVar385;
  undefined8 uVar386;
  undefined1 auVar388 [12];
  undefined1 auVar391 [14];
  undefined1 auVar392 [14];
  undefined1 auVar393 [14];
  undefined1 auVar394 [14];
  undefined1 auVar398 [16];
  undefined1 auVar399 [16];
  undefined1 auVar400 [16];
  undefined1 auVar401 [16];
  undefined6 uVar410;
  undefined8 uVar411;
  undefined1 auVar412 [12];
  undefined1 auVar415 [14];
  undefined1 auVar416 [14];
  undefined1 auVar417 [14];
  undefined1 auVar423 [16];
  undefined1 auVar424 [16];
  undefined1 auVar425 [16];
  undefined6 uVar427;
  undefined8 uVar428;
  undefined1 auVar430 [12];
  undefined1 auVar431 [14];
  undefined1 auVar432 [14];
  undefined1 auVar434 [16];
  undefined1 auVar435 [16];
  
  auVar220 = _DAT_0012c800;
  uVar221 = 0;
  if (0x1f < len) {
    uVar221 = len & 0x7fffffe0;
    iVar226 = 0x20;
    do {
      uVar231 = *(undefined8 *)y;
      auVar193[10] = 0;
      auVar193._0_10_ = SUB1610((undefined1  [16])0x0,0);
      auVar193[0xb] = (char)((ulong)uVar231 >> 0x28);
      auVar197[9] = (char)((ulong)uVar231 >> 0x20);
      auVar197._0_9_ = SUB169((undefined1  [16])0x0,0);
      auVar197._10_2_ = auVar193._10_2_;
      auVar201._9_3_ = auVar197._9_3_;
      auVar201._0_9_ = (unkuint9)0;
      auVar144._1_10_ =
           SUB1610(ZEXT516(CONCAT41(auVar201._8_4_,(char)((ulong)uVar231 >> 0x18))) << 0x38,6);
      auVar144[0] = (char)((ulong)uVar231 >> 0x10);
      auVar144._11_5_ = 0;
      auVar143._1_12_ = SUB1612(auVar144 << 0x28,4);
      auVar143[0] = (char)((ulong)uVar231 >> 8);
      auVar143._13_3_ = 0;
      auVar238._1_14_ = SUB1614(auVar143 << 0x18,2);
      auVar238[0] = (char)uVar231;
      auVar238[0xf] = 0;
      uVar229 = *(undefined4 *)u;
      bVar248 = (byte)((uint)uVar229 >> 0x18);
      cVar246 = (char)((uint)uVar229 >> 0x10);
      auVar146._1_10_ = SUB1610(ZEXT116(bVar248) << 0x38,6);
      auVar146[0] = cVar246;
      auVar146._11_5_ = 0;
      uVar245 = (undefined1)((uint)uVar229 >> 8);
      auVar145._1_12_ = SUB1612(auVar146 << 0x28,4);
      auVar145[0] = uVar245;
      auVar145._13_3_ = 0;
      auVar283._1_14_ = SUB1614(auVar145 << 0x18,2);
      auVar283[0] = (char)uVar229;
      auVar283[0xf] = 0;
      auVar283 = auVar283 << 8;
      auVar103[0xd] = 0;
      auVar103._0_13_ = auVar283._0_13_;
      auVar103[0xe] = bVar248;
      auVar110[0xc] = 0;
      auVar110._0_12_ = auVar283._0_12_;
      auVar110._13_2_ = auVar103._13_2_;
      auVar118[0xb] = 0;
      auVar118._0_11_ = auVar283._0_11_;
      auVar118._12_3_ = auVar110._12_3_;
      auVar126[10] = cVar246;
      auVar126._0_10_ = auVar283._0_10_;
      auVar126._11_4_ = auVar118._11_4_;
      auVar134[9] = 0;
      auVar134._0_9_ = auVar283._0_9_;
      auVar134._10_5_ = auVar126._10_5_;
      auVar147[8] = 0;
      auVar147._0_8_ = auVar283._0_8_;
      auVar147._9_6_ = auVar134._9_6_;
      auVar176._7_8_ = 0;
      auVar176._0_7_ = auVar147._8_7_;
      auVar185._1_8_ = SUB158(auVar176 << 0x40,7);
      auVar185[0] = uVar245;
      auVar185._9_6_ = 0;
      auVar206._10_5_ = 0;
      auVar206._0_10_ = SUB1510(auVar185 << 0x30,5);
      auVar205._1_12_ = SUB1512(auVar206 << 0x28,3);
      auVar205[0] = (char)uVar229;
      auVar282._0_4_ = auVar205._0_4_ << 0x10;
      auVar282._8_4_ = auVar147._8_4_;
      auVar282._4_4_ = auVar282._8_4_;
      auVar282._12_4_ = SUB154(auVar185 << 0x30,5) << 8;
      auVar283 = pshuflw(auVar282,auVar282,100);
      auVar283 = pshufhw(in_XMM11,auVar283,0xcc);
      sVar71 = auVar283._0_2_;
      sVar72 = auVar283._2_2_;
      auVar337[1] = (0 < sVar72) * (sVar72 < 0x100) * auVar283[2] - (0xff < sVar72);
      auVar337[0] = (0 < sVar71) * (sVar71 < 0x100) * auVar283[0] - (0xff < sVar71);
      sVar71 = auVar283._4_2_;
      auVar337[2] = (0 < sVar71) * (sVar71 < 0x100) * auVar283[4] - (0xff < sVar71);
      sVar71 = auVar283._6_2_;
      auVar337[3] = (0 < sVar71) * (sVar71 < 0x100) * auVar283[6] - (0xff < sVar71);
      sVar71 = auVar283._8_2_;
      auVar337[4] = (0 < sVar71) * (sVar71 < 0x100) * auVar283[8] - (0xff < sVar71);
      sVar71 = auVar283._10_2_;
      auVar337[5] = (0 < sVar71) * (sVar71 < 0x100) * auVar283[10] - (0xff < sVar71);
      sVar71 = auVar283._12_2_;
      auVar337[6] = (0 < sVar71) * (sVar71 < 0x100) * auVar283[0xc] - (0xff < sVar71);
      sVar71 = auVar283._14_2_;
      auVar337[7] = (0 < sVar71) * (sVar71 < 0x100) * auVar283[0xe] - (0xff < sVar71);
      auVar337[8] = -(0xff < auVar147._8_2_);
      sVar71 = auVar126._10_2_;
      auVar337[9] = (0 < sVar71) * (sVar71 < 0x100) * cVar246 - (0xff < sVar71);
      auVar337[10] = -(0xff < auVar147._8_2_);
      auVar337[0xb] = (0 < sVar71) * (sVar71 < 0x100) * cVar246 - (0xff < sVar71);
      auVar337[0xc] = -(0xff < auVar110._12_2_);
      uVar228 = (ushort)bVar248;
      auVar337[0xd] = (bVar248 != 0) * (uVar228 < 0x100) * bVar248 - (0xff < uVar228);
      auVar337[0xe] = -(0xff < auVar110._12_2_);
      auVar337[0xf] = (bVar248 != 0) * (uVar228 < 0x100) * bVar248 - (0xff < uVar228);
      uVar229 = *(undefined4 *)v;
      bVar248 = (byte)((uint)uVar229 >> 0x18);
      cVar246 = (char)((uint)uVar229 >> 0x10);
      auVar149._1_10_ = SUB1610(ZEXT116(bVar248) << 0x38,6);
      auVar149[0] = cVar246;
      auVar149._11_5_ = 0;
      uVar245 = (undefined1)((uint)uVar229 >> 8);
      auVar148._1_12_ = SUB1612(auVar149 << 0x28,4);
      auVar148[0] = uVar245;
      auVar148._13_3_ = 0;
      auVar338._1_14_ = SUB1614(auVar148 << 0x18,2);
      auVar338[0] = (char)uVar229;
      auVar338[0xf] = 0;
      auVar338 = auVar338 << 8;
      auVar111[0xd] = 0;
      auVar111._0_13_ = auVar338._0_13_;
      auVar111[0xe] = bVar248;
      auVar119[0xc] = 0;
      auVar119._0_12_ = auVar338._0_12_;
      auVar119._13_2_ = auVar111._13_2_;
      auVar127[0xb] = 0;
      auVar127._0_11_ = auVar338._0_11_;
      auVar127._12_3_ = auVar119._12_3_;
      auVar135[10] = cVar246;
      auVar135._0_10_ = auVar338._0_10_;
      auVar135._11_4_ = auVar127._11_4_;
      auVar150[9] = 0;
      auVar150._0_9_ = auVar338._0_9_;
      auVar150._10_5_ = auVar135._10_5_;
      auVar175[8] = 0;
      auVar175._0_8_ = auVar338._0_8_;
      auVar175._9_6_ = auVar150._9_6_;
      auVar177._7_8_ = 0;
      auVar177._0_7_ = auVar175._8_7_;
      auVar186._1_8_ = SUB158(auVar177 << 0x40,7);
      auVar186[0] = uVar245;
      auVar186._9_6_ = 0;
      auVar207._10_5_ = 0;
      auVar207._0_10_ = SUB1510(auVar186 << 0x30,5);
      auVar178._1_12_ = SUB1512(auVar207 << 0x28,3);
      auVar178[0] = (char)uVar229;
      auVar284._0_4_ = auVar178._0_4_ << 0x10;
      auVar284._8_4_ = auVar175._8_4_;
      auVar284._4_4_ = auVar284._8_4_;
      auVar284._12_4_ = SUB154(auVar186 << 0x30,5) << 8;
      auVar283 = pshuflw(auVar284,auVar284,100);
      auVar283 = pshufhw(in_XMM4,auVar283,0xcc);
      sVar71 = auVar283._0_2_;
      sVar72 = auVar283._2_2_;
      auVar295[1] = (0 < sVar72) * (sVar72 < 0x100) * auVar283[2] - (0xff < sVar72);
      auVar295[0] = (0 < sVar71) * (sVar71 < 0x100) * auVar283[0] - (0xff < sVar71);
      sVar71 = auVar283._4_2_;
      auVar295[2] = (0 < sVar71) * (sVar71 < 0x100) * auVar283[4] - (0xff < sVar71);
      sVar71 = auVar283._6_2_;
      auVar295[3] = (0 < sVar71) * (sVar71 < 0x100) * auVar283[6] - (0xff < sVar71);
      sVar71 = auVar283._8_2_;
      auVar295[4] = (0 < sVar71) * (sVar71 < 0x100) * auVar283[8] - (0xff < sVar71);
      sVar71 = auVar283._10_2_;
      auVar295[5] = (0 < sVar71) * (sVar71 < 0x100) * auVar283[10] - (0xff < sVar71);
      sVar71 = auVar283._12_2_;
      auVar295[6] = (0 < sVar71) * (sVar71 < 0x100) * auVar283[0xc] - (0xff < sVar71);
      sVar71 = auVar283._14_2_;
      auVar295[7] = (0 < sVar71) * (sVar71 < 0x100) * auVar283[0xe] - (0xff < sVar71);
      auVar295[8] = -(0xff < auVar175._8_2_);
      sVar71 = auVar135._10_2_;
      auVar295[9] = (0 < sVar71) * (sVar71 < 0x100) * cVar246 - (0xff < sVar71);
      auVar295[10] = -(0xff < auVar175._8_2_);
      auVar295[0xb] = (0 < sVar71) * (sVar71 < 0x100) * cVar246 - (0xff < sVar71);
      auVar295[0xc] = -(0xff < auVar119._12_2_);
      uVar228 = (ushort)bVar248;
      auVar295[0xd] = (bVar248 != 0) * (uVar228 < 0x100) * bVar248 - (0xff < uVar228);
      auVar295[0xe] = -(0xff < auVar119._12_2_);
      auVar295[0xf] = (bVar248 != 0) * (uVar228 < 0x100) * bVar248 - (0xff < uVar228);
      auVar283 = pmulhuw(auVar238 << 8,_DAT_0012c8f0);
      auVar238 = pmulhuw(auVar295,_DAT_0012c900);
      auVar338 = pmulhuw(auVar337,_DAT_0012c950);
      auVar339 = paddusw(auVar338,auVar283);
      auVar266._0_2_ = auVar283._0_2_ + -0x379a + auVar238._0_2_;
      auVar266._2_2_ = auVar283._2_2_ + -0x379a + auVar238._2_2_;
      auVar266._4_2_ = auVar283._4_2_ + -0x379a + auVar238._4_2_;
      auVar266._6_2_ = auVar283._6_2_ + -0x379a + auVar238._6_2_;
      auVar266._8_2_ = auVar283._8_2_ + -0x379a + auVar238._8_2_;
      auVar266._10_2_ = auVar283._10_2_ + -0x379a + auVar238._10_2_;
      auVar266._12_2_ = auVar283._12_2_ + -0x379a + auVar238._12_2_;
      auVar266._14_2_ = auVar283._14_2_ + -0x379a + auVar238._14_2_;
      auVar338 = pmulhuw(auVar337,_DAT_0012c920);
      auVar238 = pmulhuw(auVar295,_DAT_0012c930);
      auVar285._0_2_ = (auVar283._0_2_ - (auVar238._0_2_ + auVar338._0_2_)) + 0x2204;
      auVar285._2_2_ = (auVar283._2_2_ - (auVar238._2_2_ + auVar338._2_2_)) + 0x2204;
      auVar285._4_2_ = (auVar283._4_2_ - (auVar238._4_2_ + auVar338._4_2_)) + 0x2204;
      auVar285._6_2_ = (auVar283._6_2_ - (auVar238._6_2_ + auVar338._6_2_)) + 0x2204;
      auVar285._8_2_ = (auVar283._8_2_ - (auVar238._8_2_ + auVar338._8_2_)) + 0x2204;
      auVar285._10_2_ = (auVar283._10_2_ - (auVar238._10_2_ + auVar338._10_2_)) + 0x2204;
      auVar285._12_2_ = (auVar283._12_2_ - (auVar238._12_2_ + auVar338._12_2_)) + 0x2204;
      auVar285._14_2_ = (auVar283._14_2_ - (auVar238._14_2_ + auVar338._14_2_)) + 0x2204;
      auVar238 = psubusw(auVar339,_DAT_0012c960);
      auVar283 = psraw(auVar266,6);
      auVar338 = psraw(auVar285,6);
      uVar324 = auVar238._0_2_ >> 6;
      uVar344 = auVar238._2_2_ >> 6;
      uVar346 = auVar238._4_2_ >> 6;
      uVar348 = auVar238._6_2_ >> 6;
      uVar350 = auVar238._8_2_ >> 6;
      uVar352 = auVar238._10_2_ >> 6;
      uVar354 = auVar238._12_2_ >> 6;
      uVar356 = auVar238._14_2_ >> 6;
      uVar231 = *(undefined8 *)(y + 8);
      auVar194[10] = 0;
      auVar194._0_10_ = SUB1610((undefined1  [16])0x0,0);
      auVar194[0xb] = (char)((ulong)uVar231 >> 0x28);
      auVar198[9] = (char)((ulong)uVar231 >> 0x20);
      auVar198._0_9_ = SUB169((undefined1  [16])0x0,0);
      auVar198._10_2_ = auVar194._10_2_;
      auVar202._9_3_ = auVar198._9_3_;
      auVar202._0_9_ = (unkuint9)0;
      auVar152._1_10_ =
           SUB1610(ZEXT516(CONCAT41(auVar202._8_4_,(char)((ulong)uVar231 >> 0x18))) << 0x38,6);
      auVar152[0] = (char)((ulong)uVar231 >> 0x10);
      auVar152._11_5_ = 0;
      auVar151._1_12_ = SUB1612(auVar152 << 0x28,4);
      auVar151[0] = (char)((ulong)uVar231 >> 8);
      auVar151._13_3_ = 0;
      auVar339._1_14_ = SUB1614(auVar151 << 0x18,2);
      auVar339[0] = (char)uVar231;
      auVar339[0xf] = 0;
      uVar229 = *(undefined4 *)(u + 4);
      bVar248 = (byte)((uint)uVar229 >> 0x18);
      cVar246 = (char)((uint)uVar229 >> 0x10);
      auVar154._1_10_ = SUB1610(ZEXT116(bVar248) << 0x38,6);
      auVar154[0] = cVar246;
      auVar154._11_5_ = 0;
      uVar245 = (undefined1)((uint)uVar229 >> 8);
      auVar153._1_12_ = SUB1612(auVar154 << 0x28,4);
      auVar153[0] = uVar245;
      auVar153._13_3_ = 0;
      auVar310._1_14_ = SUB1614(auVar153 << 0x18,2);
      auVar310[0] = (char)uVar229;
      auVar310[0xf] = 0;
      auVar310 = auVar310 << 8;
      auVar104[0xd] = 0;
      auVar104._0_13_ = auVar310._0_13_;
      auVar104[0xe] = bVar248;
      auVar112[0xc] = 0;
      auVar112._0_12_ = auVar310._0_12_;
      auVar112._13_2_ = auVar104._13_2_;
      auVar120[0xb] = 0;
      auVar120._0_11_ = auVar310._0_11_;
      auVar120._12_3_ = auVar112._12_3_;
      auVar128[10] = cVar246;
      auVar128._0_10_ = auVar310._0_10_;
      auVar128._11_4_ = auVar120._11_4_;
      auVar136[9] = 0;
      auVar136._0_9_ = auVar310._0_9_;
      auVar136._10_5_ = auVar128._10_5_;
      auVar155[8] = 0;
      auVar155._0_8_ = auVar310._0_8_;
      auVar155._9_6_ = auVar136._9_6_;
      auVar179._7_8_ = 0;
      auVar179._0_7_ = auVar155._8_7_;
      auVar187._1_8_ = SUB158(auVar179 << 0x40,7);
      auVar187[0] = uVar245;
      auVar187._9_6_ = 0;
      auVar209._10_5_ = 0;
      auVar209._0_10_ = SUB1510(auVar187 << 0x30,5);
      auVar208._1_12_ = SUB1512(auVar209 << 0x28,3);
      auVar208[0] = (char)uVar229;
      auVar239._4_4_ = auVar155._8_4_;
      auVar239._0_4_ = auVar208._0_4_ << 0x10;
      auVar239._8_4_ = auVar155._8_4_;
      auVar239._12_4_ = SUB154(auVar187 << 0x30,5) << 8;
      auVar238 = pshuflw(auVar239,auVar239,100);
      auVar238 = pshufhw(auVar238,auVar238,0xcc);
      sVar71 = auVar238._0_2_;
      sVar72 = auVar238._2_2_;
      auVar240[1] = (0 < sVar72) * (sVar72 < 0x100) * auVar238[2] - (0xff < sVar72);
      auVar240[0] = (0 < sVar71) * (sVar71 < 0x100) * auVar238[0] - (0xff < sVar71);
      sVar71 = auVar238._4_2_;
      auVar240[2] = (0 < sVar71) * (sVar71 < 0x100) * auVar238[4] - (0xff < sVar71);
      sVar71 = auVar238._6_2_;
      auVar240[3] = (0 < sVar71) * (sVar71 < 0x100) * auVar238[6] - (0xff < sVar71);
      sVar71 = auVar238._8_2_;
      auVar240[4] = (0 < sVar71) * (sVar71 < 0x100) * auVar238[8] - (0xff < sVar71);
      sVar71 = auVar238._10_2_;
      auVar240[5] = (0 < sVar71) * (sVar71 < 0x100) * auVar238[10] - (0xff < sVar71);
      sVar71 = auVar238._12_2_;
      auVar240[6] = (0 < sVar71) * (sVar71 < 0x100) * auVar238[0xc] - (0xff < sVar71);
      sVar71 = auVar238._14_2_;
      auVar240[7] = (0 < sVar71) * (sVar71 < 0x100) * auVar238[0xe] - (0xff < sVar71);
      auVar240[8] = -(0xff < auVar155._8_2_);
      sVar71 = auVar128._10_2_;
      auVar240[9] = (0 < sVar71) * (sVar71 < 0x100) * cVar246 - (0xff < sVar71);
      auVar240[10] = -(0xff < auVar155._8_2_);
      auVar240[0xb] = (0 < sVar71) * (sVar71 < 0x100) * cVar246 - (0xff < sVar71);
      auVar240[0xc] = -(0xff < auVar112._12_2_);
      uVar228 = (ushort)bVar248;
      auVar240[0xd] = (bVar248 != 0) * (uVar228 < 0x100) * bVar248 - (0xff < uVar228);
      auVar240[0xe] = -(0xff < auVar112._12_2_);
      auVar240[0xf] = (bVar248 != 0) * (uVar228 < 0x100) * bVar248 - (0xff < uVar228);
      uVar229 = *(undefined4 *)(v + 4);
      bVar248 = (byte)((uint)uVar229 >> 0x18);
      cVar246 = (char)((uint)uVar229 >> 0x10);
      auVar157._1_10_ = SUB1610(ZEXT116(bVar248) << 0x38,6);
      auVar157[0] = cVar246;
      auVar157._11_5_ = 0;
      uVar245 = (undefined1)((uint)uVar229 >> 8);
      auVar156._1_12_ = SUB1612(auVar157 << 0x28,4);
      auVar156[0] = uVar245;
      auVar156._13_3_ = 0;
      auVar395._1_14_ = SUB1614(auVar156 << 0x18,2);
      auVar395[0] = (char)uVar229;
      auVar395[0xf] = 0;
      auVar395 = auVar395 << 8;
      auVar105[0xd] = 0;
      auVar105._0_13_ = auVar395._0_13_;
      auVar105[0xe] = bVar248;
      auVar113[0xc] = 0;
      auVar113._0_12_ = auVar395._0_12_;
      auVar113._13_2_ = auVar105._13_2_;
      auVar121[0xb] = 0;
      auVar121._0_11_ = auVar395._0_11_;
      auVar121._12_3_ = auVar113._12_3_;
      auVar129[10] = cVar246;
      auVar129._0_10_ = auVar395._0_10_;
      auVar129._11_4_ = auVar121._11_4_;
      auVar137[9] = 0;
      auVar137._0_9_ = auVar395._0_9_;
      auVar137._10_5_ = auVar129._10_5_;
      auVar158[8] = 0;
      auVar158._0_8_ = auVar395._0_8_;
      auVar158._9_6_ = auVar137._9_6_;
      auVar180._7_8_ = 0;
      auVar180._0_7_ = auVar158._8_7_;
      auVar188._1_8_ = SUB158(auVar180 << 0x40,7);
      auVar188[0] = uVar245;
      auVar188._9_6_ = 0;
      auVar211._10_5_ = 0;
      auVar211._0_10_ = SUB1510(auVar188 << 0x30,5);
      auVar210._1_12_ = SUB1512(auVar211 << 0x28,3);
      auVar210[0] = (char)uVar229;
      auVar368._0_4_ = auVar210._0_4_ << 0x10;
      auVar368._8_4_ = auVar158._8_4_;
      auVar368._4_4_ = auVar368._8_4_;
      auVar368._12_4_ = SUB154(auVar188 << 0x30,5) << 8;
      auVar238 = pshuflw(auVar368,auVar368,100);
      auVar238 = pshufhw(auVar238,auVar238,0xcc);
      sVar71 = auVar238._0_2_;
      sVar72 = auVar238._2_2_;
      auVar369[1] = (0 < sVar72) * (sVar72 < 0x100) * auVar238[2] - (0xff < sVar72);
      auVar369[0] = (0 < sVar71) * (sVar71 < 0x100) * auVar238[0] - (0xff < sVar71);
      sVar71 = auVar238._4_2_;
      auVar369[2] = (0 < sVar71) * (sVar71 < 0x100) * auVar238[4] - (0xff < sVar71);
      sVar71 = auVar238._6_2_;
      auVar369[3] = (0 < sVar71) * (sVar71 < 0x100) * auVar238[6] - (0xff < sVar71);
      sVar71 = auVar238._8_2_;
      auVar369[4] = (0 < sVar71) * (sVar71 < 0x100) * auVar238[8] - (0xff < sVar71);
      sVar71 = auVar238._10_2_;
      auVar369[5] = (0 < sVar71) * (sVar71 < 0x100) * auVar238[10] - (0xff < sVar71);
      sVar71 = auVar238._12_2_;
      auVar369[6] = (0 < sVar71) * (sVar71 < 0x100) * auVar238[0xc] - (0xff < sVar71);
      sVar71 = auVar238._14_2_;
      auVar369[7] = (0 < sVar71) * (sVar71 < 0x100) * auVar238[0xe] - (0xff < sVar71);
      auVar369[8] = -(0xff < auVar158._8_2_);
      sVar71 = auVar129._10_2_;
      auVar369[9] = (0 < sVar71) * (sVar71 < 0x100) * cVar246 - (0xff < sVar71);
      auVar369[10] = -(0xff < auVar158._8_2_);
      auVar369[0xb] = (0 < sVar71) * (sVar71 < 0x100) * cVar246 - (0xff < sVar71);
      auVar369[0xc] = -(0xff < auVar113._12_2_);
      uVar228 = (ushort)bVar248;
      auVar369[0xd] = (bVar248 != 0) * (uVar228 < 0x100) * bVar248 - (0xff < uVar228);
      auVar369[0xe] = -(0xff < auVar113._12_2_);
      auVar369[0xf] = (bVar248 != 0) * (uVar228 < 0x100) * bVar248 - (0xff < uVar228);
      auVar339 = pmulhuw(auVar339 << 8,_DAT_0012c8f0);
      auVar310 = pmulhuw(auVar369,_DAT_0012c900);
      auVar238 = pmulhuw(auVar240,_DAT_0012c950);
      auVar238 = paddusw(auVar238,auVar339);
      auVar296._0_2_ = auVar339._0_2_ + -0x379a + auVar310._0_2_;
      auVar296._2_2_ = auVar339._2_2_ + -0x379a + auVar310._2_2_;
      auVar296._4_2_ = auVar339._4_2_ + -0x379a + auVar310._4_2_;
      auVar296._6_2_ = auVar339._6_2_ + -0x379a + auVar310._6_2_;
      auVar296._8_2_ = auVar339._8_2_ + -0x379a + auVar310._8_2_;
      auVar296._10_2_ = auVar339._10_2_ + -0x379a + auVar310._10_2_;
      auVar296._12_2_ = auVar339._12_2_ + -0x379a + auVar310._12_2_;
      auVar296._14_2_ = auVar339._14_2_ + -0x379a + auVar310._14_2_;
      auVar395 = pmulhuw(auVar240,_DAT_0012c920);
      auVar310 = pmulhuw(auVar369,_DAT_0012c930);
      auVar418._0_2_ = (auVar339._0_2_ - (auVar310._0_2_ + auVar395._0_2_)) + 0x2204;
      auVar418._2_2_ = (auVar339._2_2_ - (auVar310._2_2_ + auVar395._2_2_)) + 0x2204;
      auVar418._4_2_ = (auVar339._4_2_ - (auVar310._4_2_ + auVar395._4_2_)) + 0x2204;
      auVar418._6_2_ = (auVar339._6_2_ - (auVar310._6_2_ + auVar395._6_2_)) + 0x2204;
      auVar418._8_2_ = (auVar339._8_2_ - (auVar310._8_2_ + auVar395._8_2_)) + 0x2204;
      auVar418._10_2_ = (auVar339._10_2_ - (auVar310._10_2_ + auVar395._10_2_)) + 0x2204;
      auVar418._12_2_ = (auVar339._12_2_ - (auVar310._12_2_ + auVar395._12_2_)) + 0x2204;
      auVar418._14_2_ = (auVar339._14_2_ - (auVar310._14_2_ + auVar395._14_2_)) + 0x2204;
      auVar238 = psubusw(auVar238,_DAT_0012c960);
      auVar339 = psraw(auVar296,6);
      sVar71 = auVar283._0_2_;
      sVar72 = auVar283._2_2_;
      bVar248 = (0 < sVar72) * (sVar72 < 0x100) * auVar283[2] - (0xff < sVar72);
      sVar72 = auVar283._4_2_;
      sVar76 = auVar283._6_2_;
      cVar1 = (0 < sVar76) * (sVar76 < 0x100) * auVar283[6] - (0xff < sVar76);
      uVar255 = CONCAT13(cVar1,CONCAT12((0 < sVar72) * (sVar72 < 0x100) * auVar283[4] -
                                        (0xff < sVar72),
                                        CONCAT11(bVar248,(0 < sVar71) * (sVar71 < 0x100) *
                                                         auVar283[0] - (0xff < sVar71))));
      sVar71 = auVar283._8_2_;
      sVar72 = auVar283._10_2_;
      cVar246 = (0 < sVar72) * (sVar72 < 0x100) * auVar283[10] - (0xff < sVar72);
      uVar256 = CONCAT15(cVar246,CONCAT14((0 < sVar71) * (sVar71 < 0x100) * auVar283[8] -
                                          (0xff < sVar71),uVar255));
      sVar71 = auVar283._12_2_;
      sVar72 = auVar283._14_2_;
      cVar2 = (0 < sVar72) * (sVar72 < 0x100) * auVar283[0xe] - (0xff < sVar72);
      uVar257 = CONCAT17(cVar2,CONCAT16((0 < sVar71) * (sVar71 < 0x100) * auVar283[0xc] -
                                        (0xff < sVar71),uVar256));
      sVar71 = auVar339._0_2_;
      sVar72 = auVar339._2_2_;
      cVar3 = (0 < sVar72) * (sVar72 < 0x100) * auVar339[2] - (0xff < sVar72);
      auVar258._0_10_ =
           CONCAT19(cVar3,CONCAT18((0 < sVar71) * (sVar71 < 0x100) * auVar339[0] - (0xff < sVar71),
                                   uVar257));
      sVar71 = auVar339._4_2_;
      auVar258[10] = (0 < sVar71) * (sVar71 < 0x100) * auVar339[4] - (0xff < sVar71);
      sVar71 = auVar339._6_2_;
      cVar4 = (0 < sVar71) * (sVar71 < 0x100) * auVar339[6] - (0xff < sVar71);
      auVar258[0xb] = cVar4;
      sVar71 = auVar339._8_2_;
      auVar262[0xc] = (0 < sVar71) * (sVar71 < 0x100) * auVar339[8] - (0xff < sVar71);
      auVar262._0_12_ = auVar258;
      sVar71 = auVar339._10_2_;
      cVar5 = (0 < sVar71) * (sVar71 < 0x100) * auVar339[10] - (0xff < sVar71);
      auVar262[0xd] = cVar5;
      sVar71 = auVar339._12_2_;
      auVar267[0xe] = (0 < sVar71) * (sVar71 < 0x100) * auVar339[0xc] - (0xff < sVar71);
      auVar267._0_14_ = auVar262;
      sVar71 = auVar339._14_2_;
      cVar6 = (0 < sVar71) * (sVar71 < 0x100) * auVar339[0xe] - (0xff < sVar71);
      auVar267[0xf] = cVar6;
      auVar283 = psraw(auVar418,6);
      sVar71 = auVar338._0_2_;
      sVar72 = auVar338._2_2_;
      bVar7 = (0 < sVar72) * (sVar72 < 0x100) * auVar338[2] - (0xff < sVar72);
      sVar72 = auVar338._4_2_;
      sVar76 = auVar338._6_2_;
      cVar8 = (0 < sVar76) * (sVar76 < 0x100) * auVar338[6] - (0xff < sVar76);
      uVar271 = CONCAT13(cVar8,CONCAT12((0 < sVar72) * (sVar72 < 0x100) * auVar338[4] -
                                        (0xff < sVar72),
                                        CONCAT11(bVar7,(0 < sVar71) * (sVar71 < 0x100) * auVar338[0]
                                                       - (0xff < sVar71))));
      sVar71 = auVar338._8_2_;
      sVar72 = auVar338._10_2_;
      cVar9 = (0 < sVar72) * (sVar72 < 0x100) * auVar338[10] - (0xff < sVar72);
      uVar272 = CONCAT15(cVar9,CONCAT14((0 < sVar71) * (sVar71 < 0x100) * auVar338[8] -
                                        (0xff < sVar71),uVar271));
      sVar71 = auVar338._12_2_;
      sVar72 = auVar338._14_2_;
      cVar10 = (0 < sVar72) * (sVar72 < 0x100) * auVar338[0xe] - (0xff < sVar72);
      uVar273 = CONCAT17(cVar10,CONCAT16((0 < sVar71) * (sVar71 < 0x100) * auVar338[0xc] -
                                         (0xff < sVar71),uVar272));
      sVar71 = auVar283._0_2_;
      sVar72 = auVar283._2_2_;
      cVar11 = (0 < sVar72) * (sVar72 < 0x100) * auVar283[2] - (0xff < sVar72);
      auVar274._0_10_ =
           CONCAT19(cVar11,CONCAT18((0 < sVar71) * (sVar71 < 0x100) * auVar283[0] - (0xff < sVar71),
                                    uVar273));
      sVar71 = auVar283._4_2_;
      auVar274[10] = (0 < sVar71) * (sVar71 < 0x100) * auVar283[4] - (0xff < sVar71);
      sVar71 = auVar283._6_2_;
      cVar12 = (0 < sVar71) * (sVar71 < 0x100) * auVar283[6] - (0xff < sVar71);
      auVar274[0xb] = cVar12;
      sVar71 = auVar283._8_2_;
      auVar278[0xc] = (0 < sVar71) * (sVar71 < 0x100) * auVar283[8] - (0xff < sVar71);
      auVar278._0_12_ = auVar274;
      sVar71 = auVar283._10_2_;
      cVar13 = (0 < sVar71) * (sVar71 < 0x100) * auVar283[10] - (0xff < sVar71);
      auVar278[0xd] = cVar13;
      sVar71 = auVar283._12_2_;
      auVar286[0xe] = (0 < sVar71) * (sVar71 < 0x100) * auVar283[0xc] - (0xff < sVar71);
      auVar286._0_14_ = auVar278;
      sVar71 = auVar283._14_2_;
      cVar14 = (0 < sVar71) * (sVar71 < 0x100) * auVar283[0xe] - (0xff < sVar71);
      auVar286[0xf] = cVar14;
      uVar228 = auVar238._0_2_ >> 6;
      uVar247 = auVar238._2_2_ >> 6;
      uVar249 = auVar238._4_2_ >> 6;
      uVar250 = auVar238._6_2_ >> 6;
      uVar251 = auVar238._8_2_ >> 6;
      uVar252 = auVar238._10_2_ >> 6;
      uVar253 = auVar238._12_2_ >> 6;
      uVar254 = auVar238._14_2_ >> 6;
      bVar15 = (uVar344 != 0) * (uVar344 < 0x100) * (char)uVar344 - (0xff < uVar344);
      cVar16 = (uVar348 != 0) * (uVar348 < 0x100) * (char)uVar348 - (0xff < uVar348);
      uVar303 = CONCAT13(cVar16,CONCAT12((uVar346 != 0) * (uVar346 < 0x100) * (char)uVar346 -
                                         (0xff < uVar346),
                                         CONCAT11(bVar15,(uVar324 != 0) * (uVar324 < 0x100) *
                                                         (char)uVar324 - (0xff < uVar324))));
      cVar17 = (uVar352 != 0) * (uVar352 < 0x100) * (char)uVar352 - (0xff < uVar352);
      uVar304 = CONCAT15(cVar17,CONCAT14((uVar350 != 0) * (uVar350 < 0x100) * (char)uVar350 -
                                         (0xff < uVar350),uVar303));
      cVar18 = (uVar356 != 0) * (uVar356 < 0x100) * (char)uVar356 - (0xff < uVar356);
      uVar305 = CONCAT17(cVar18,CONCAT16((uVar354 != 0) * (uVar354 < 0x100) * (char)uVar354 -
                                         (0xff < uVar354),uVar304));
      cVar19 = (uVar247 != 0) * (uVar247 < 0x100) * (char)uVar247 - (0xff < uVar247);
      auVar329._0_10_ =
           CONCAT19(cVar19,CONCAT18((uVar228 != 0) * (uVar228 < 0x100) * (char)uVar228 -
                                    (0xff < uVar228),uVar305));
      auVar329[10] = (uVar249 != 0) * (uVar249 < 0x100) * (char)uVar249 - (0xff < uVar249);
      cVar20 = (uVar250 != 0) * (uVar250 < 0x100) * (char)uVar250 - (0xff < uVar250);
      auVar329[0xb] = cVar20;
      auVar333[0xc] = (uVar251 != 0) * (uVar251 < 0x100) * (char)uVar251 - (0xff < uVar251);
      auVar333._0_12_ = auVar329;
      cVar21 = (uVar252 != 0) * (uVar252 < 0x100) * (char)uVar252 - (0xff < uVar252);
      auVar333[0xd] = cVar21;
      auVar340[0xe] = (uVar253 != 0) * (uVar253 < 0x100) * (char)uVar253 - (0xff < uVar253);
      auVar340._0_14_ = auVar333;
      cVar22 = (uVar254 != 0) * (uVar254 < 0x100) * (char)uVar254 - (0xff < uVar254);
      auVar340[0xf] = cVar22;
      uVar231 = *(undefined8 *)(y + 0x10);
      auVar195[10] = 0;
      auVar195._0_10_ = SUB1610((undefined1  [16])0x0,0);
      auVar195[0xb] = (char)((ulong)uVar231 >> 0x28);
      auVar199[9] = (char)((ulong)uVar231 >> 0x20);
      auVar199._0_9_ = SUB169((undefined1  [16])0x0,0);
      auVar199._10_2_ = auVar195._10_2_;
      auVar203._9_3_ = auVar199._9_3_;
      auVar203._0_9_ = (unkuint9)0;
      auVar160._1_10_ =
           SUB1610(ZEXT516(CONCAT41(auVar203._8_4_,(char)((ulong)uVar231 >> 0x18))) << 0x38,6);
      auVar160[0] = (char)((ulong)uVar231 >> 0x10);
      auVar160._11_5_ = 0;
      auVar159._1_12_ = SUB1612(auVar160 << 0x28,4);
      auVar159[0] = (char)((ulong)uVar231 >> 8);
      auVar159._13_3_ = 0;
      auVar397._1_14_ = SUB1614(auVar159 << 0x18,2);
      auVar397[0] = (char)uVar231;
      auVar397[0xf] = 0;
      uVar229 = *(undefined4 *)(u + 8);
      bVar300 = (byte)((uint)uVar229 >> 0x18);
      cVar299 = (char)((uint)uVar229 >> 0x10);
      auVar162._1_10_ = SUB1610(ZEXT116(bVar300) << 0x38,6);
      auVar162[0] = cVar299;
      auVar162._11_5_ = 0;
      uVar245 = (undefined1)((uint)uVar229 >> 8);
      auVar161._1_12_ = SUB1612(auVar162 << 0x28,4);
      auVar161[0] = uVar245;
      auVar161._13_3_ = 0;
      auVar422._1_14_ = SUB1614(auVar161 << 0x18,2);
      auVar422[0] = (char)uVar229;
      auVar422[0xf] = 0;
      auVar422 = auVar422 << 8;
      auVar106[0xd] = 0;
      auVar106._0_13_ = auVar422._0_13_;
      auVar106[0xe] = bVar300;
      auVar114[0xc] = 0;
      auVar114._0_12_ = auVar422._0_12_;
      auVar114._13_2_ = auVar106._13_2_;
      auVar122[0xb] = 0;
      auVar122._0_11_ = auVar422._0_11_;
      auVar122._12_3_ = auVar114._12_3_;
      auVar130[10] = cVar299;
      auVar130._0_10_ = auVar422._0_10_;
      auVar130._11_4_ = auVar122._11_4_;
      auVar138[9] = 0;
      auVar138._0_9_ = auVar422._0_9_;
      auVar138._10_5_ = auVar130._10_5_;
      auVar163[8] = 0;
      auVar163._0_8_ = auVar422._0_8_;
      auVar163._9_6_ = auVar138._9_6_;
      auVar181._7_8_ = 0;
      auVar181._0_7_ = auVar163._8_7_;
      auVar189._1_8_ = SUB158(auVar181 << 0x40,7);
      auVar189[0] = uVar245;
      auVar189._9_6_ = 0;
      auVar213._10_5_ = 0;
      auVar213._0_10_ = SUB1510(auVar189 << 0x30,5);
      auVar212._1_12_ = SUB1512(auVar213 << 0x28,3);
      auVar212[0] = (char)uVar229;
      auVar311._0_4_ = auVar212._0_4_ << 0x10;
      auVar311._8_4_ = auVar163._8_4_;
      auVar311._4_4_ = auVar311._8_4_;
      auVar311._12_4_ = SUB154(auVar189 << 0x30,5) << 8;
      auVar238 = pshuflw(auVar311,auVar311,100);
      auVar238 = pshufhw(auVar395,auVar238,0xcc);
      sVar71 = auVar238._0_2_;
      sVar72 = auVar238._2_2_;
      auVar396[1] = (0 < sVar72) * (sVar72 < 0x100) * auVar238[2] - (0xff < sVar72);
      auVar396[0] = (0 < sVar71) * (sVar71 < 0x100) * auVar238[0] - (0xff < sVar71);
      sVar71 = auVar238._4_2_;
      auVar396[2] = (0 < sVar71) * (sVar71 < 0x100) * auVar238[4] - (0xff < sVar71);
      sVar71 = auVar238._6_2_;
      auVar396[3] = (0 < sVar71) * (sVar71 < 0x100) * auVar238[6] - (0xff < sVar71);
      sVar71 = auVar238._8_2_;
      auVar396[4] = (0 < sVar71) * (sVar71 < 0x100) * auVar238[8] - (0xff < sVar71);
      sVar71 = auVar238._10_2_;
      auVar396[5] = (0 < sVar71) * (sVar71 < 0x100) * auVar238[10] - (0xff < sVar71);
      sVar71 = auVar238._12_2_;
      auVar396[6] = (0 < sVar71) * (sVar71 < 0x100) * auVar238[0xc] - (0xff < sVar71);
      sVar71 = auVar238._14_2_;
      auVar396[7] = (0 < sVar71) * (sVar71 < 0x100) * auVar238[0xe] - (0xff < sVar71);
      auVar396[8] = -(0xff < auVar163._8_2_);
      sVar71 = auVar130._10_2_;
      auVar396[9] = (0 < sVar71) * (sVar71 < 0x100) * cVar299 - (0xff < sVar71);
      auVar396[10] = -(0xff < auVar163._8_2_);
      auVar396[0xb] = (0 < sVar71) * (sVar71 < 0x100) * cVar299 - (0xff < sVar71);
      auVar396[0xc] = -(0xff < auVar114._12_2_);
      uVar228 = (ushort)bVar300;
      auVar396[0xd] = (bVar300 != 0) * (uVar228 < 0x100) * bVar300 - (0xff < uVar228);
      auVar396[0xe] = -(0xff < auVar114._12_2_);
      auVar396[0xf] = (bVar300 != 0) * (uVar228 < 0x100) * bVar300 - (0xff < uVar228);
      uVar229 = *(undefined4 *)(v + 8);
      bVar300 = (byte)((uint)uVar229 >> 0x18);
      cVar299 = (char)((uint)uVar229 >> 0x10);
      auVar165._1_10_ = SUB1610(ZEXT116(bVar300) << 0x38,6);
      auVar165[0] = cVar299;
      auVar165._11_5_ = 0;
      uVar245 = (undefined1)((uint)uVar229 >> 8);
      auVar164._1_12_ = SUB1612(auVar165 << 0x28,4);
      auVar164[0] = uVar245;
      auVar164._13_3_ = 0;
      auVar312._1_14_ = SUB1614(auVar164 << 0x18,2);
      auVar312[0] = (char)uVar229;
      auVar312[0xf] = 0;
      auVar312 = auVar312 << 8;
      auVar107[0xd] = 0;
      auVar107._0_13_ = auVar312._0_13_;
      auVar107[0xe] = bVar300;
      auVar115[0xc] = 0;
      auVar115._0_12_ = auVar312._0_12_;
      auVar115._13_2_ = auVar107._13_2_;
      auVar123[0xb] = 0;
      auVar123._0_11_ = auVar312._0_11_;
      auVar123._12_3_ = auVar115._12_3_;
      auVar131[10] = cVar299;
      auVar131._0_10_ = auVar312._0_10_;
      auVar131._11_4_ = auVar123._11_4_;
      auVar139[9] = 0;
      auVar139._0_9_ = auVar312._0_9_;
      auVar139._10_5_ = auVar131._10_5_;
      auVar166[8] = 0;
      auVar166._0_8_ = auVar312._0_8_;
      auVar166._9_6_ = auVar139._9_6_;
      auVar182._7_8_ = 0;
      auVar182._0_7_ = auVar166._8_7_;
      auVar190._1_8_ = SUB158(auVar182 << 0x40,7);
      auVar190[0] = uVar245;
      auVar190._9_6_ = 0;
      auVar215._10_5_ = 0;
      auVar215._0_10_ = SUB1510(auVar190 << 0x30,5);
      auVar214._1_12_ = SUB1512(auVar215 << 0x28,3);
      auVar214[0] = (char)uVar229;
      auVar313._0_4_ = auVar214._0_4_ << 0x10;
      auVar313._8_4_ = auVar166._8_4_;
      auVar313._4_4_ = auVar313._8_4_;
      auVar313._12_4_ = SUB154(auVar190 << 0x30,5) << 8;
      auVar238 = pshuflw(auVar313,auVar313,100);
      auVar238 = pshufhw(auVar238,auVar238,0xcc);
      sVar71 = auVar238._0_2_;
      sVar72 = auVar238._2_2_;
      auVar314[1] = (0 < sVar72) * (sVar72 < 0x100) * auVar238[2] - (0xff < sVar72);
      auVar314[0] = (0 < sVar71) * (sVar71 < 0x100) * auVar238[0] - (0xff < sVar71);
      sVar71 = auVar238._4_2_;
      auVar314[2] = (0 < sVar71) * (sVar71 < 0x100) * auVar238[4] - (0xff < sVar71);
      sVar71 = auVar238._6_2_;
      auVar314[3] = (0 < sVar71) * (sVar71 < 0x100) * auVar238[6] - (0xff < sVar71);
      sVar71 = auVar238._8_2_;
      auVar314[4] = (0 < sVar71) * (sVar71 < 0x100) * auVar238[8] - (0xff < sVar71);
      sVar71 = auVar238._10_2_;
      auVar314[5] = (0 < sVar71) * (sVar71 < 0x100) * auVar238[10] - (0xff < sVar71);
      sVar71 = auVar238._12_2_;
      auVar314[6] = (0 < sVar71) * (sVar71 < 0x100) * auVar238[0xc] - (0xff < sVar71);
      sVar71 = auVar238._14_2_;
      auVar314[7] = (0 < sVar71) * (sVar71 < 0x100) * auVar238[0xe] - (0xff < sVar71);
      auVar314[8] = -(0xff < auVar166._8_2_);
      sVar71 = auVar131._10_2_;
      auVar314[9] = (0 < sVar71) * (sVar71 < 0x100) * cVar299 - (0xff < sVar71);
      auVar314[10] = -(0xff < auVar166._8_2_);
      auVar314[0xb] = (0 < sVar71) * (sVar71 < 0x100) * cVar299 - (0xff < sVar71);
      auVar314[0xc] = -(0xff < auVar115._12_2_);
      uVar228 = (ushort)bVar300;
      auVar314[0xd] = (bVar300 != 0) * (uVar228 < 0x100) * bVar300 - (0xff < uVar228);
      auVar314[0xe] = -(0xff < auVar115._12_2_);
      auVar314[0xf] = (bVar300 != 0) * (uVar228 < 0x100) * bVar300 - (0xff < uVar228);
      auVar238 = pmulhuw(auVar397 << 8,_DAT_0012c8f0);
      auVar283 = pmulhuw(auVar314,_DAT_0012c900);
      auVar338 = pmulhuw(auVar396,_DAT_0012c950);
      auVar397 = paddusw(auVar338,auVar238);
      auVar241._0_2_ = auVar238._0_2_ + -0x379a + auVar283._0_2_;
      auVar241._2_2_ = auVar238._2_2_ + -0x379a + auVar283._2_2_;
      auVar241._4_2_ = auVar238._4_2_ + -0x379a + auVar283._4_2_;
      auVar241._6_2_ = auVar238._6_2_ + -0x379a + auVar283._6_2_;
      auVar241._8_2_ = auVar238._8_2_ + -0x379a + auVar283._8_2_;
      auVar241._10_2_ = auVar238._10_2_ + -0x379a + auVar283._10_2_;
      auVar241._12_2_ = auVar238._12_2_ + -0x379a + auVar283._12_2_;
      auVar241._14_2_ = auVar238._14_2_ + -0x379a + auVar283._14_2_;
      auVar310 = pmulhuw(auVar396,_DAT_0012c920);
      auVar338 = pmulhuw(auVar314,_DAT_0012c930);
      uVar231 = *(undefined8 *)(y + 0x18);
      auVar196[10] = 0;
      auVar196._0_10_ = SUB1610((undefined1  [16])0x0,0);
      auVar196[0xb] = (char)((ulong)uVar231 >> 0x28);
      auVar200[9] = (char)((ulong)uVar231 >> 0x20);
      auVar200._0_9_ = SUB169((undefined1  [16])0x0,0);
      auVar200._10_2_ = auVar196._10_2_;
      auVar204._9_3_ = auVar200._9_3_;
      auVar204._0_9_ = (unkuint9)0;
      auVar168._1_10_ =
           SUB1610(ZEXT516(CONCAT41(auVar204._8_4_,(char)((ulong)uVar231 >> 0x18))) << 0x38,6);
      auVar168[0] = (char)((ulong)uVar231 >> 0x10);
      auVar168._11_5_ = 0;
      auVar167._1_12_ = SUB1612(auVar168 << 0x28,4);
      auVar167[0] = (char)((ulong)uVar231 >> 8);
      auVar167._13_3_ = 0;
      auVar140._1_14_ = SUB1614(auVar167 << 0x18,2);
      auVar140[0] = (char)uVar231;
      auVar140[0xf] = 0;
      uVar229 = *(undefined4 *)(u + 0xc);
      bVar300 = (byte)((uint)uVar229 >> 0x18);
      cVar299 = (char)((uint)uVar229 >> 0x10);
      auVar170._1_10_ = SUB1610(ZEXT116(bVar300) << 0x38,6);
      auVar170[0] = cVar299;
      auVar170._11_5_ = 0;
      uVar245 = (undefined1)((uint)uVar229 >> 8);
      auVar169._1_12_ = SUB1612(auVar170 << 0x28,4);
      auVar169[0] = uVar245;
      auVar169._13_3_ = 0;
      auVar370._1_14_ = SUB1614(auVar169 << 0x18,2);
      auVar370[0] = (char)uVar229;
      auVar370[0xf] = 0;
      auVar370 = auVar370 << 8;
      auVar108[0xd] = 0;
      auVar108._0_13_ = auVar370._0_13_;
      auVar108[0xe] = bVar300;
      auVar116[0xc] = 0;
      auVar116._0_12_ = auVar370._0_12_;
      auVar116._13_2_ = auVar108._13_2_;
      auVar124[0xb] = 0;
      auVar124._0_11_ = auVar370._0_11_;
      auVar124._12_3_ = auVar116._12_3_;
      auVar132[10] = cVar299;
      auVar132._0_10_ = auVar370._0_10_;
      auVar132._11_4_ = auVar124._11_4_;
      auVar141[9] = 0;
      auVar141._0_9_ = auVar370._0_9_;
      auVar141._10_5_ = auVar132._10_5_;
      auVar171[8] = 0;
      auVar171._0_8_ = auVar370._0_8_;
      auVar171._9_6_ = auVar141._9_6_;
      auVar183._7_8_ = 0;
      auVar183._0_7_ = auVar171._8_7_;
      auVar191._1_8_ = SUB158(auVar183 << 0x40,7);
      auVar191[0] = uVar245;
      auVar191._9_6_ = 0;
      auVar217._10_5_ = 0;
      auVar217._0_10_ = SUB1510(auVar191 << 0x30,5);
      auVar216._1_12_ = SUB1512(auVar217 << 0x28,3);
      auVar216[0] = (char)uVar229;
      auVar371._0_4_ = auVar216._0_4_ << 0x10;
      auVar371._8_4_ = auVar171._8_4_;
      auVar371._4_4_ = auVar371._8_4_;
      auVar371._12_4_ = SUB154(auVar191 << 0x30,5) << 8;
      auVar283 = pshuflw(auVar371,auVar371,100);
      auVar283 = pshufhw(auVar283,auVar283,0xcc);
      sVar71 = auVar283._0_2_;
      sVar72 = auVar283._2_2_;
      auVar372[1] = (0 < sVar72) * (sVar72 < 0x100) * auVar283[2] - (0xff < sVar72);
      auVar372[0] = (0 < sVar71) * (sVar71 < 0x100) * auVar283[0] - (0xff < sVar71);
      sVar71 = auVar283._4_2_;
      auVar372[2] = (0 < sVar71) * (sVar71 < 0x100) * auVar283[4] - (0xff < sVar71);
      sVar71 = auVar283._6_2_;
      auVar372[3] = (0 < sVar71) * (sVar71 < 0x100) * auVar283[6] - (0xff < sVar71);
      sVar71 = auVar283._8_2_;
      auVar372[4] = (0 < sVar71) * (sVar71 < 0x100) * auVar283[8] - (0xff < sVar71);
      sVar71 = auVar283._10_2_;
      auVar372[5] = (0 < sVar71) * (sVar71 < 0x100) * auVar283[10] - (0xff < sVar71);
      sVar71 = auVar283._12_2_;
      auVar372[6] = (0 < sVar71) * (sVar71 < 0x100) * auVar283[0xc] - (0xff < sVar71);
      sVar71 = auVar283._14_2_;
      auVar372[7] = (0 < sVar71) * (sVar71 < 0x100) * auVar283[0xe] - (0xff < sVar71);
      auVar372[8] = -(0xff < auVar171._8_2_);
      sVar71 = auVar132._10_2_;
      auVar372[9] = (0 < sVar71) * (sVar71 < 0x100) * cVar299 - (0xff < sVar71);
      auVar372[10] = -(0xff < auVar171._8_2_);
      auVar372[0xb] = (0 < sVar71) * (sVar71 < 0x100) * cVar299 - (0xff < sVar71);
      auVar372[0xc] = -(0xff < auVar116._12_2_);
      uVar228 = (ushort)bVar300;
      auVar372[0xd] = (bVar300 != 0) * (uVar228 < 0x100) * bVar300 - (0xff < uVar228);
      auVar372[0xe] = -(0xff < auVar116._12_2_);
      auVar372[0xf] = (bVar300 != 0) * (uVar228 < 0x100) * bVar300 - (0xff < uVar228);
      uVar229 = *(undefined4 *)(v + 0xc);
      bVar300 = (byte)((uint)uVar229 >> 0x18);
      cVar299 = (char)((uint)uVar229 >> 0x10);
      auVar173._1_10_ = SUB1610(ZEXT116(bVar300) << 0x38,6);
      auVar173[0] = cVar299;
      auVar173._11_5_ = 0;
      uVar245 = (undefined1)((uint)uVar229 >> 8);
      auVar172._1_12_ = SUB1612(auVar173 << 0x28,4);
      auVar172[0] = uVar245;
      auVar172._13_3_ = 0;
      auVar419._1_14_ = SUB1614(auVar172 << 0x18,2);
      auVar419[0] = (char)uVar229;
      auVar419[0xf] = 0;
      auVar419 = auVar419 << 8;
      auVar109[0xd] = 0;
      auVar109._0_13_ = auVar419._0_13_;
      auVar109[0xe] = bVar300;
      auVar117[0xc] = 0;
      auVar117._0_12_ = auVar419._0_12_;
      auVar117._13_2_ = auVar109._13_2_;
      auVar125[0xb] = 0;
      auVar125._0_11_ = auVar419._0_11_;
      auVar125._12_3_ = auVar117._12_3_;
      auVar133[10] = cVar299;
      auVar133._0_10_ = auVar419._0_10_;
      auVar133._11_4_ = auVar125._11_4_;
      auVar142[9] = 0;
      auVar142._0_9_ = auVar419._0_9_;
      auVar142._10_5_ = auVar133._10_5_;
      auVar174[8] = 0;
      auVar174._0_8_ = auVar419._0_8_;
      auVar174._9_6_ = auVar142._9_6_;
      auVar184._7_8_ = 0;
      auVar184._0_7_ = auVar174._8_7_;
      auVar192._1_8_ = SUB158(auVar184 << 0x40,7);
      auVar192[0] = uVar245;
      auVar192._9_6_ = 0;
      auVar219._10_5_ = 0;
      auVar219._0_10_ = SUB1510(auVar192 << 0x30,5);
      auVar218._1_12_ = SUB1512(auVar219 << 0x28,3);
      auVar218[0] = (char)uVar229;
      auVar420._0_4_ = auVar218._0_4_ << 0x10;
      auVar420._8_4_ = auVar174._8_4_;
      auVar420._4_4_ = auVar420._8_4_;
      auVar420._12_4_ = SUB154(auVar192 << 0x30,5) << 8;
      auVar283 = pshuflw(auVar420,auVar420,100);
      auVar283 = pshufhw(auVar283,auVar283,0xcc);
      sVar71 = auVar283._0_2_;
      sVar72 = auVar283._2_2_;
      auVar421[1] = (0 < sVar72) * (sVar72 < 0x100) * auVar283[2] - (0xff < sVar72);
      auVar421[0] = (0 < sVar71) * (sVar71 < 0x100) * auVar283[0] - (0xff < sVar71);
      sVar71 = auVar283._4_2_;
      auVar421[2] = (0 < sVar71) * (sVar71 < 0x100) * auVar283[4] - (0xff < sVar71);
      sVar71 = auVar283._6_2_;
      auVar421[3] = (0 < sVar71) * (sVar71 < 0x100) * auVar283[6] - (0xff < sVar71);
      sVar71 = auVar283._8_2_;
      auVar421[4] = (0 < sVar71) * (sVar71 < 0x100) * auVar283[8] - (0xff < sVar71);
      sVar71 = auVar283._10_2_;
      auVar421[5] = (0 < sVar71) * (sVar71 < 0x100) * auVar283[10] - (0xff < sVar71);
      sVar71 = auVar283._12_2_;
      auVar421[6] = (0 < sVar71) * (sVar71 < 0x100) * auVar283[0xc] - (0xff < sVar71);
      sVar71 = auVar283._14_2_;
      auVar421[7] = (0 < sVar71) * (sVar71 < 0x100) * auVar283[0xe] - (0xff < sVar71);
      auVar421[8] = -(0xff < auVar174._8_2_);
      sVar71 = auVar133._10_2_;
      auVar421[9] = (0 < sVar71) * (sVar71 < 0x100) * cVar299 - (0xff < sVar71);
      auVar421[10] = -(0xff < auVar174._8_2_);
      auVar421[0xb] = (0 < sVar71) * (sVar71 < 0x100) * cVar299 - (0xff < sVar71);
      auVar421[0xc] = -(0xff < auVar117._12_2_);
      uVar228 = (ushort)bVar300;
      auVar421[0xd] = (bVar300 != 0) * (uVar228 < 0x100) * bVar300 - (0xff < uVar228);
      auVar421[0xe] = -(0xff < auVar117._12_2_);
      auVar421[0xf] = (bVar300 != 0) * (uVar228 < 0x100) * bVar300 - (0xff < uVar228);
      auVar283 = pmulhuw(auVar140 << 8,_DAT_0012c8f0);
      auVar339 = pmulhuw(auVar421,_DAT_0012c900);
      auVar297._0_2_ = auVar283._0_2_ + -0x379a + auVar339._0_2_;
      auVar297._2_2_ = auVar283._2_2_ + -0x379a + auVar339._2_2_;
      auVar297._4_2_ = auVar283._4_2_ + -0x379a + auVar339._4_2_;
      auVar297._6_2_ = auVar283._6_2_ + -0x379a + auVar339._6_2_;
      auVar297._8_2_ = auVar283._8_2_ + -0x379a + auVar339._8_2_;
      auVar297._10_2_ = auVar283._10_2_ + -0x379a + auVar339._10_2_;
      auVar297._12_2_ = auVar283._12_2_ + -0x379a + auVar339._12_2_;
      auVar297._14_2_ = auVar283._14_2_ + -0x379a + auVar339._14_2_;
      auVar339 = pmulhuw(auVar372,_DAT_0012c920);
      auVar422 = pmulhuw(auVar421,_DAT_0012c930);
      auVar395 = pmulhuw(auVar372,_DAT_0012c950);
      auVar395 = paddusw(auVar395,auVar283);
      auVar433._0_2_ = (auVar238._0_2_ - (auVar338._0_2_ + auVar310._0_2_)) + 0x2204;
      auVar433._2_2_ = (auVar238._2_2_ - (auVar338._2_2_ + auVar310._2_2_)) + 0x2204;
      auVar433._4_2_ = (auVar238._4_2_ - (auVar338._4_2_ + auVar310._4_2_)) + 0x2204;
      auVar433._6_2_ = (auVar238._6_2_ - (auVar338._6_2_ + auVar310._6_2_)) + 0x2204;
      auVar433._8_2_ = (auVar238._8_2_ - (auVar338._8_2_ + auVar310._8_2_)) + 0x2204;
      auVar433._10_2_ = (auVar238._10_2_ - (auVar338._10_2_ + auVar310._10_2_)) + 0x2204;
      auVar433._12_2_ = (auVar238._12_2_ - (auVar338._12_2_ + auVar310._12_2_)) + 0x2204;
      auVar433._14_2_ = (auVar238._14_2_ - (auVar338._14_2_ + auVar310._14_2_)) + 0x2204;
      auVar338 = psubusw(auVar397,_DAT_0012c960);
      auVar238 = psraw(auVar241,6);
      auVar310 = psraw(auVar433,6);
      uVar324 = auVar338._0_2_ >> 6;
      uVar344 = auVar338._2_2_ >> 6;
      uVar346 = auVar338._4_2_ >> 6;
      uVar348 = auVar338._6_2_ >> 6;
      uVar350 = auVar338._8_2_ >> 6;
      uVar352 = auVar338._10_2_ >> 6;
      uVar354 = auVar338._12_2_ >> 6;
      uVar356 = auVar338._14_2_ >> 6;
      auVar301._0_2_ = (auVar283._0_2_ - (auVar422._0_2_ + auVar339._0_2_)) + 0x2204;
      auVar301._2_2_ = (auVar283._2_2_ - (auVar422._2_2_ + auVar339._2_2_)) + 0x2204;
      auVar301._4_2_ = (auVar283._4_2_ - (auVar422._4_2_ + auVar339._4_2_)) + 0x2204;
      auVar301._6_2_ = (auVar283._6_2_ - (auVar422._6_2_ + auVar339._6_2_)) + 0x2204;
      auVar301._8_2_ = (auVar283._8_2_ - (auVar422._8_2_ + auVar339._8_2_)) + 0x2204;
      auVar301._10_2_ = (auVar283._10_2_ - (auVar422._10_2_ + auVar339._10_2_)) + 0x2204;
      auVar301._12_2_ = (auVar283._12_2_ - (auVar422._12_2_ + auVar339._12_2_)) + 0x2204;
      auVar301._14_2_ = (auVar283._14_2_ - (auVar422._14_2_ + auVar339._14_2_)) + 0x2204;
      auVar338 = psubusw(auVar395,_DAT_0012c960);
      auVar283 = psraw(auVar297,6);
      sVar71 = auVar238._0_2_;
      sVar72 = auVar238._2_2_;
      bVar300 = (0 < sVar72) * (sVar72 < 0x100) * auVar238[2] - (0xff < sVar72);
      sVar72 = auVar238._4_2_;
      sVar76 = auVar238._6_2_;
      cVar299 = (0 < sVar76) * (sVar76 < 0x100) * auVar238[6] - (0xff < sVar76);
      uVar229 = CONCAT13(cVar299,CONCAT12((0 < sVar72) * (sVar72 < 0x100) * auVar238[4] -
                                          (0xff < sVar72),
                                          CONCAT11(bVar300,(0 < sVar71) * (sVar71 < 0x100) *
                                                           auVar238[0] - (0xff < sVar71))));
      sVar71 = auVar238._8_2_;
      sVar72 = auVar238._10_2_;
      cVar23 = (0 < sVar72) * (sVar72 < 0x100) * auVar238[10] - (0xff < sVar72);
      uVar230 = CONCAT15(cVar23,CONCAT14((0 < sVar71) * (sVar71 < 0x100) * auVar238[8] -
                                         (0xff < sVar71),uVar229));
      sVar71 = auVar238._12_2_;
      sVar72 = auVar238._14_2_;
      cVar24 = (0 < sVar72) * (sVar72 < 0x100) * auVar238[0xe] - (0xff < sVar72);
      uVar231 = CONCAT17(cVar24,CONCAT16((0 < sVar71) * (sVar71 < 0x100) * auVar238[0xc] -
                                         (0xff < sVar71),uVar230));
      sVar71 = auVar283._0_2_;
      sVar72 = auVar283._2_2_;
      cVar25 = (0 < sVar72) * (sVar72 < 0x100) * auVar283[2] - (0xff < sVar72);
      auVar232._0_10_ =
           CONCAT19(cVar25,CONCAT18((0 < sVar71) * (sVar71 < 0x100) * auVar283[0] - (0xff < sVar71),
                                    uVar231));
      sVar71 = auVar283._4_2_;
      auVar232[10] = (0 < sVar71) * (sVar71 < 0x100) * auVar283[4] - (0xff < sVar71);
      sVar71 = auVar283._6_2_;
      cVar26 = (0 < sVar71) * (sVar71 < 0x100) * auVar283[6] - (0xff < sVar71);
      auVar232[0xb] = cVar26;
      sVar71 = auVar283._8_2_;
      auVar235[0xc] = (0 < sVar71) * (sVar71 < 0x100) * auVar283[8] - (0xff < sVar71);
      auVar235._0_12_ = auVar232;
      sVar71 = auVar283._10_2_;
      cVar27 = (0 < sVar71) * (sVar71 < 0x100) * auVar283[10] - (0xff < sVar71);
      auVar235[0xd] = cVar27;
      sVar71 = auVar283._12_2_;
      auVar242[0xe] = (0 < sVar71) * (sVar71 < 0x100) * auVar283[0xc] - (0xff < sVar71);
      auVar242._0_14_ = auVar235;
      sVar71 = auVar283._14_2_;
      cVar28 = (0 < sVar71) * (sVar71 < 0x100) * auVar283[0xe] - (0xff < sVar71);
      auVar242[0xf] = cVar28;
      auVar238 = psraw(auVar301,6);
      sVar71 = auVar310._0_2_;
      sVar72 = auVar310._2_2_;
      bVar29 = (0 < sVar72) * (sVar72 < 0x100) * auVar310[2] - (0xff < sVar72);
      sVar72 = auVar310._4_2_;
      sVar76 = auVar310._6_2_;
      cVar30 = (0 < sVar76) * (sVar76 < 0x100) * auVar310[6] - (0xff < sVar76);
      uVar384 = CONCAT13(cVar30,CONCAT12((0 < sVar72) * (sVar72 < 0x100) * auVar310[4] -
                                         (0xff < sVar72),
                                         CONCAT11(bVar29,(0 < sVar71) * (sVar71 < 0x100) *
                                                         auVar310[0] - (0xff < sVar71))));
      sVar71 = auVar310._8_2_;
      sVar72 = auVar310._10_2_;
      cVar31 = (0 < sVar72) * (sVar72 < 0x100) * auVar310[10] - (0xff < sVar72);
      uVar385 = CONCAT15(cVar31,CONCAT14((0 < sVar71) * (sVar71 < 0x100) * auVar310[8] -
                                         (0xff < sVar71),uVar384));
      sVar71 = auVar310._12_2_;
      sVar72 = auVar310._14_2_;
      cVar32 = (0 < sVar72) * (sVar72 < 0x100) * auVar310[0xe] - (0xff < sVar72);
      uVar386 = CONCAT17(cVar32,CONCAT16((0 < sVar71) * (sVar71 < 0x100) * auVar310[0xc] -
                                         (0xff < sVar71),uVar385));
      sVar71 = auVar238._0_2_;
      sVar72 = auVar238._2_2_;
      cVar33 = (0 < sVar72) * (sVar72 < 0x100) * auVar238[2] - (0xff < sVar72);
      auVar429._0_10_ =
           CONCAT19(cVar33,CONCAT18((0 < sVar71) * (sVar71 < 0x100) * auVar238[0] - (0xff < sVar71),
                                    uVar386));
      sVar71 = auVar238._4_2_;
      auVar429[10] = (0 < sVar71) * (sVar71 < 0x100) * auVar238[4] - (0xff < sVar71);
      sVar71 = auVar238._6_2_;
      cVar34 = (0 < sVar71) * (sVar71 < 0x100) * auVar238[6] - (0xff < sVar71);
      auVar429[0xb] = cVar34;
      sVar71 = auVar238._8_2_;
      auVar431[0xc] = (0 < sVar71) * (sVar71 < 0x100) * auVar238[8] - (0xff < sVar71);
      auVar431._0_12_ = auVar429;
      sVar71 = auVar238._10_2_;
      cVar35 = (0 < sVar71) * (sVar71 < 0x100) * auVar238[10] - (0xff < sVar71);
      auVar431[0xd] = cVar35;
      sVar71 = auVar238._12_2_;
      auVar434[0xe] = (0 < sVar71) * (sVar71 < 0x100) * auVar238[0xc] - (0xff < sVar71);
      auVar434._0_14_ = auVar431;
      sVar71 = auVar238._14_2_;
      cVar36 = (0 < sVar71) * (sVar71 < 0x100) * auVar238[0xe] - (0xff < sVar71);
      auVar434[0xf] = cVar36;
      uVar228 = auVar338._0_2_ >> 6;
      uVar247 = auVar338._2_2_ >> 6;
      uVar249 = auVar338._4_2_ >> 6;
      uVar250 = auVar338._6_2_ >> 6;
      uVar251 = auVar338._8_2_ >> 6;
      uVar252 = auVar338._10_2_ >> 6;
      uVar253 = auVar338._12_2_ >> 6;
      uVar254 = auVar338._14_2_ >> 6;
      bVar37 = (uVar344 != 0) * (uVar344 < 0x100) * (char)uVar344 - (0xff < uVar344);
      cVar38 = (uVar348 != 0) * (uVar348 < 0x100) * (char)uVar348 - (0xff < uVar348);
      uVar359 = CONCAT13(cVar38,CONCAT12((uVar346 != 0) * (uVar346 < 0x100) * (char)uVar346 -
                                         (0xff < uVar346),
                                         CONCAT11(bVar37,(uVar324 != 0) * (uVar324 < 0x100) *
                                                         (char)uVar324 - (0xff < uVar324))));
      cVar39 = (uVar352 != 0) * (uVar352 < 0x100) * (char)uVar352 - (0xff < uVar352);
      uVar360 = CONCAT15(cVar39,CONCAT14((uVar350 != 0) * (uVar350 < 0x100) * (char)uVar350 -
                                         (0xff < uVar350),uVar359));
      cVar40 = (uVar356 != 0) * (uVar356 < 0x100) * (char)uVar356 - (0xff < uVar356);
      uVar361 = CONCAT17(cVar40,CONCAT16((uVar354 != 0) * (uVar354 < 0x100) * (char)uVar354 -
                                         (0xff < uVar354),uVar360));
      cVar41 = (uVar247 != 0) * (uVar247 < 0x100) * (char)uVar247 - (0xff < uVar247);
      auVar387._0_10_ =
           CONCAT19(cVar41,CONCAT18((uVar228 != 0) * (uVar228 < 0x100) * (char)uVar228 -
                                    (0xff < uVar228),uVar361));
      auVar387[10] = (uVar249 != 0) * (uVar249 < 0x100) * (char)uVar249 - (0xff < uVar249);
      cVar42 = (uVar250 != 0) * (uVar250 < 0x100) * (char)uVar250 - (0xff < uVar250);
      auVar387[0xb] = cVar42;
      auVar391[0xc] = (uVar251 != 0) * (uVar251 < 0x100) * (char)uVar251 - (0xff < uVar251);
      auVar391._0_12_ = auVar387;
      cVar43 = (uVar252 != 0) * (uVar252 < 0x100) * (char)uVar252 - (0xff < uVar252);
      auVar391[0xd] = cVar43;
      auVar398[0xe] = (uVar253 != 0) * (uVar253 < 0x100) * (char)uVar253 - (0xff < uVar253);
      auVar398._0_14_ = auVar391;
      cVar44 = (uVar254 != 0) * (uVar254 < 0x100) * (char)uVar254 - (0xff < uVar254);
      auVar398[0xf] = cVar44;
      auVar283 = auVar267 & auVar220;
      auVar238 = auVar242 & auVar220;
      sVar71 = auVar283._0_2_;
      sVar72 = auVar283._2_2_;
      bVar45 = (0 < sVar72) * (sVar72 < 0x100) * auVar283[2] - (0xff < sVar72);
      sVar72 = auVar283._4_2_;
      sVar76 = auVar283._6_2_;
      cVar46 = (0 < sVar76) * (sVar76 < 0x100) * auVar283[6] - (0xff < sVar76);
      uVar326 = CONCAT13(cVar46,CONCAT12((0 < sVar72) * (sVar72 < 0x100) * auVar283[4] -
                                         (0xff < sVar72),
                                         CONCAT11(bVar45,(0 < sVar71) * (sVar71 < 0x100) *
                                                         auVar283[0] - (0xff < sVar71))));
      sVar71 = auVar283._8_2_;
      sVar72 = auVar283._10_2_;
      cVar47 = (0 < sVar72) * (sVar72 < 0x100) * auVar283[10] - (0xff < sVar72);
      uVar327 = CONCAT15(cVar47,CONCAT14((0 < sVar71) * (sVar71 < 0x100) * auVar283[8] -
                                         (0xff < sVar71),uVar326));
      sVar71 = auVar283._12_2_;
      sVar72 = auVar283._14_2_;
      cVar48 = (0 < sVar72) * (sVar72 < 0x100) * auVar283[0xe] - (0xff < sVar72);
      uVar328 = CONCAT17(cVar48,CONCAT16((0 < sVar71) * (sVar71 < 0x100) * auVar283[0xc] -
                                         (0xff < sVar71),uVar327));
      sVar71 = auVar238._0_2_;
      sVar72 = auVar238._2_2_;
      cVar49 = (0 < sVar72) * (sVar72 < 0x100) * auVar238[2] - (0xff < sVar72);
      auVar362._0_10_ =
           CONCAT19(cVar49,CONCAT18((0 < sVar71) * (sVar71 < 0x100) * auVar238[0] - (0xff < sVar71),
                                    uVar328));
      sVar71 = auVar238._4_2_;
      auVar362[10] = (0 < sVar71) * (sVar71 < 0x100) * auVar238[4] - (0xff < sVar71);
      sVar71 = auVar238._6_2_;
      cVar50 = (0 < sVar71) * (sVar71 < 0x100) * auVar238[6] - (0xff < sVar71);
      auVar362[0xb] = cVar50;
      sVar71 = auVar238._8_2_;
      auVar365[0xc] = (0 < sVar71) * (sVar71 < 0x100) * auVar238[8] - (0xff < sVar71);
      auVar365._0_12_ = auVar362;
      sVar71 = auVar238._10_2_;
      cVar51 = (0 < sVar71) * (sVar71 < 0x100) * auVar238[10] - (0xff < sVar71);
      auVar365[0xd] = cVar51;
      sVar71 = auVar238._12_2_;
      auVar373[0xe] = (0 < sVar71) * (sVar71 < 0x100) * auVar238[0xc] - (0xff < sVar71);
      auVar373._0_14_ = auVar365;
      sVar71 = auVar238._14_2_;
      cVar52 = (0 < sVar71) * (sVar71 < 0x100) * auVar238[0xe] - (0xff < sVar71);
      auVar373[0xf] = cVar52;
      auVar283 = auVar286 & auVar220;
      auVar238 = auVar434 & auVar220;
      sVar71 = auVar283._0_2_;
      sVar72 = auVar283._2_2_;
      bVar53 = (0 < sVar72) * (sVar72 < 0x100) * auVar283[2] - (0xff < sVar72);
      sVar72 = auVar283._4_2_;
      sVar76 = auVar283._6_2_;
      cVar54 = (0 < sVar76) * (sVar76 < 0x100) * auVar283[6] - (0xff < sVar76);
      uVar290 = CONCAT13(cVar54,CONCAT12((0 < sVar72) * (sVar72 < 0x100) * auVar283[4] -
                                         (0xff < sVar72),
                                         CONCAT11(bVar53,(0 < sVar71) * (sVar71 < 0x100) *
                                                         auVar283[0] - (0xff < sVar71))));
      sVar71 = auVar283._8_2_;
      sVar72 = auVar283._10_2_;
      cVar55 = (0 < sVar72) * (sVar72 < 0x100) * auVar283[10] - (0xff < sVar72);
      uVar291 = CONCAT15(cVar55,CONCAT14((0 < sVar71) * (sVar71 < 0x100) * auVar283[8] -
                                         (0xff < sVar71),uVar290));
      sVar71 = auVar283._12_2_;
      sVar72 = auVar283._14_2_;
      cVar56 = (0 < sVar72) * (sVar72 < 0x100) * auVar283[0xe] - (0xff < sVar72);
      uVar292 = CONCAT17(cVar56,CONCAT16((0 < sVar71) * (sVar71 < 0x100) * auVar283[0xc] -
                                         (0xff < sVar71),uVar291));
      sVar71 = auVar238._0_2_;
      sVar72 = auVar238._2_2_;
      cVar57 = (0 < sVar72) * (sVar72 < 0x100) * auVar238[2] - (0xff < sVar72);
      auVar306._0_10_ =
           CONCAT19(cVar57,CONCAT18((0 < sVar71) * (sVar71 < 0x100) * auVar238[0] - (0xff < sVar71),
                                    uVar292));
      sVar71 = auVar238._4_2_;
      auVar306[10] = (0 < sVar71) * (sVar71 < 0x100) * auVar238[4] - (0xff < sVar71);
      sVar71 = auVar238._6_2_;
      cVar58 = (0 < sVar71) * (sVar71 < 0x100) * auVar238[6] - (0xff < sVar71);
      auVar306[0xb] = cVar58;
      sVar71 = auVar238._8_2_;
      auVar308[0xc] = (0 < sVar71) * (sVar71 < 0x100) * auVar238[8] - (0xff < sVar71);
      auVar308._0_12_ = auVar306;
      sVar71 = auVar238._10_2_;
      cVar59 = (0 < sVar71) * (sVar71 < 0x100) * auVar238[10] - (0xff < sVar71);
      auVar308[0xd] = cVar59;
      sVar71 = auVar238._12_2_;
      auVar315[0xe] = (0 < sVar71) * (sVar71 < 0x100) * auVar238[0xc] - (0xff < sVar71);
      auVar315._0_14_ = auVar308;
      sVar71 = auVar238._14_2_;
      cVar60 = (0 < sVar71) * (sVar71 < 0x100) * auVar238[0xe] - (0xff < sVar71);
      auVar315[0xf] = cVar60;
      auVar283 = auVar340 & auVar220;
      auVar238 = auVar398 & auVar220;
      sVar71 = auVar283._0_2_;
      sVar72 = auVar283._2_2_;
      bVar61 = (0 < sVar72) * (sVar72 < 0x100) * auVar283[2] - (0xff < sVar72);
      sVar72 = auVar283._4_2_;
      sVar76 = auVar283._6_2_;
      cVar62 = (0 < sVar76) * (sVar76 < 0x100) * auVar283[6] - (0xff < sVar76);
      uVar409 = CONCAT13(cVar62,CONCAT12((0 < sVar72) * (sVar72 < 0x100) * auVar283[4] -
                                         (0xff < sVar72),
                                         CONCAT11(bVar61,(0 < sVar71) * (sVar71 < 0x100) *
                                                         auVar283[0] - (0xff < sVar71))));
      sVar71 = auVar283._8_2_;
      sVar72 = auVar283._10_2_;
      cVar63 = (0 < sVar72) * (sVar72 < 0x100) * auVar283[10] - (0xff < sVar72);
      uVar410 = CONCAT15(cVar63,CONCAT14((0 < sVar71) * (sVar71 < 0x100) * auVar283[8] -
                                         (0xff < sVar71),uVar409));
      sVar71 = auVar283._12_2_;
      sVar72 = auVar283._14_2_;
      cVar64 = (0 < sVar72) * (sVar72 < 0x100) * auVar283[0xe] - (0xff < sVar72);
      uVar411 = CONCAT17(cVar64,CONCAT16((0 < sVar71) * (sVar71 < 0x100) * auVar283[0xc] -
                                         (0xff < sVar71),uVar410));
      sVar71 = auVar238._0_2_;
      sVar72 = auVar238._2_2_;
      cVar65 = (0 < sVar72) * (sVar72 < 0x100) * auVar238[2] - (0xff < sVar72);
      auVar412._0_10_ =
           CONCAT19(cVar65,CONCAT18((0 < sVar71) * (sVar71 < 0x100) * auVar238[0] - (0xff < sVar71),
                                    uVar411));
      sVar71 = auVar238._4_2_;
      auVar412[10] = (0 < sVar71) * (sVar71 < 0x100) * auVar238[4] - (0xff < sVar71);
      sVar71 = auVar238._6_2_;
      cVar66 = (0 < sVar71) * (sVar71 < 0x100) * auVar238[6] - (0xff < sVar71);
      auVar412[0xb] = cVar66;
      sVar71 = auVar238._8_2_;
      auVar415[0xc] = (0 < sVar71) * (sVar71 < 0x100) * auVar238[8] - (0xff < sVar71);
      auVar415._0_12_ = auVar412;
      sVar71 = auVar238._10_2_;
      cVar67 = (0 < sVar71) * (sVar71 < 0x100) * auVar238[10] - (0xff < sVar71);
      auVar415[0xd] = cVar67;
      sVar71 = auVar238._12_2_;
      auVar423[0xe] = (0 < sVar71) * (sVar71 < 0x100) * auVar238[0xc] - (0xff < sVar71);
      auVar423._0_14_ = auVar415;
      sVar71 = auVar238._14_2_;
      cVar68 = (0 < sVar71) * (sVar71 < 0x100) * auVar238[0xe] - (0xff < sVar71);
      auVar423[0xf] = cVar68;
      uVar324 = (ushort)bVar248;
      uVar344 = (ushort)((uint)uVar255 >> 0x18);
      uVar346 = (ushort)((uint6)uVar256 >> 0x28);
      uVar348 = (ushort)((ulong)uVar257 >> 0x38);
      uVar350 = (ushort)((unkuint10)auVar258._0_10_ >> 0x48);
      uVar352 = auVar258._10_2_ >> 8;
      uVar354 = auVar262._12_2_ >> 8;
      uVar356 = auVar267._14_2_ >> 8;
      uVar228 = (ushort)bVar300;
      uVar247 = (ushort)((uint)uVar229 >> 0x18);
      uVar249 = (ushort)((uint6)uVar230 >> 0x28);
      uVar250 = (ushort)((ulong)uVar231 >> 0x38);
      uVar251 = (ushort)((unkuint10)auVar232._0_10_ >> 0x48);
      uVar252 = auVar232._10_2_ >> 8;
      uVar253 = auVar235._12_2_ >> 8;
      uVar254 = auVar242._14_2_ >> 8;
      bVar69 = (uVar344 != 0) * (uVar344 < 0x100) * cVar1 - (0xff < uVar344);
      cVar1 = (uVar348 != 0) * (uVar348 < 0x100) * cVar2 - (0xff < uVar348);
      uVar255 = CONCAT13(cVar1,CONCAT12((uVar346 != 0) * (uVar346 < 0x100) * cVar246 -
                                        (0xff < uVar346),
                                        CONCAT11(bVar69,(uVar324 != 0) * (uVar324 < 0x100) * bVar248
                                                        - (0xff < uVar324))));
      cVar246 = (uVar352 != 0) * (uVar352 < 0x100) * cVar4 - (0xff < uVar352);
      uVar256 = CONCAT15(cVar246,CONCAT14((uVar350 != 0) * (uVar350 < 0x100) * cVar3 -
                                          (0xff < uVar350),uVar255));
      cVar6 = (uVar356 != 0) * (uVar356 < 0x100) * cVar6 - (0xff < uVar356);
      uVar257 = CONCAT17(cVar6,CONCAT16((uVar354 != 0) * (uVar354 < 0x100) * cVar5 -
                                        (0xff < uVar354),uVar256));
      cVar5 = (uVar247 != 0) * (uVar247 < 0x100) * cVar299 - (0xff < uVar247);
      auVar259._0_10_ =
           CONCAT19(cVar5,CONCAT18((uVar228 != 0) * (uVar228 < 0x100) * bVar300 - (0xff < uVar228),
                                   uVar257));
      auVar259[10] = (uVar249 != 0) * (uVar249 < 0x100) * cVar23 - (0xff < uVar249);
      cVar3 = (uVar250 != 0) * (uVar250 < 0x100) * cVar24 - (0xff < uVar250);
      auVar259[0xb] = cVar3;
      auVar263[0xc] = (uVar251 != 0) * (uVar251 < 0x100) * cVar25 - (0xff < uVar251);
      auVar263._0_12_ = auVar259;
      cVar2 = (uVar252 != 0) * (uVar252 < 0x100) * cVar26 - (0xff < uVar252);
      auVar263[0xd] = cVar2;
      auVar268[0xe] = (uVar253 != 0) * (uVar253 < 0x100) * cVar27 - (0xff < uVar253);
      auVar268._0_14_ = auVar263;
      cVar4 = (uVar254 != 0) * (uVar254 < 0x100) * cVar28 - (0xff < uVar254);
      auVar268[0xf] = cVar4;
      uVar228 = (ushort)bVar7;
      uVar247 = (ushort)((uint)uVar271 >> 0x18);
      uVar249 = (ushort)((uint6)uVar272 >> 0x28);
      uVar250 = (ushort)((ulong)uVar273 >> 0x38);
      uVar251 = (ushort)((unkuint10)auVar274._0_10_ >> 0x48);
      uVar252 = auVar274._10_2_ >> 8;
      uVar253 = auVar278._12_2_ >> 8;
      uVar254 = auVar286._14_2_ >> 8;
      uVar324 = (ushort)bVar29;
      uVar344 = (ushort)((uint)uVar384 >> 0x18);
      uVar346 = (ushort)((uint6)uVar385 >> 0x28);
      uVar348 = (ushort)((ulong)uVar386 >> 0x38);
      uVar350 = (ushort)((unkuint10)auVar429._0_10_ >> 0x48);
      uVar352 = auVar429._10_2_ >> 8;
      uVar354 = auVar431._12_2_ >> 8;
      uVar356 = auVar434._14_2_ >> 8;
      bVar248 = (uVar247 != 0) * (uVar247 < 0x100) * cVar8 - (0xff < uVar247);
      cVar23 = (uVar250 != 0) * (uVar250 < 0x100) * cVar10 - (0xff < uVar250);
      uVar271 = CONCAT13(cVar23,CONCAT12((uVar249 != 0) * (uVar249 < 0x100) * cVar9 -
                                         (0xff < uVar249),
                                         CONCAT11(bVar248,(uVar228 != 0) * (uVar228 < 0x100) * bVar7
                                                          - (0xff < uVar228))));
      cVar299 = (uVar252 != 0) * (uVar252 < 0x100) * cVar12 - (0xff < uVar252);
      uVar272 = CONCAT15(cVar299,CONCAT14((uVar251 != 0) * (uVar251 < 0x100) * cVar11 -
                                          (0xff < uVar251),uVar271));
      cVar12 = (uVar254 != 0) * (uVar254 < 0x100) * cVar14 - (0xff < uVar254);
      uVar273 = CONCAT17(cVar12,CONCAT16((uVar253 != 0) * (uVar253 < 0x100) * cVar13 -
                                         (0xff < uVar253),uVar272));
      cVar11 = (uVar344 != 0) * (uVar344 < 0x100) * cVar30 - (0xff < uVar344);
      auVar275._0_10_ =
           CONCAT19(cVar11,CONCAT18((uVar324 != 0) * (uVar324 < 0x100) * bVar29 - (0xff < uVar324),
                                    uVar273));
      auVar275[10] = (uVar346 != 0) * (uVar346 < 0x100) * cVar31 - (0xff < uVar346);
      cVar8 = (uVar348 != 0) * (uVar348 < 0x100) * cVar32 - (0xff < uVar348);
      auVar275[0xb] = cVar8;
      auVar279[0xc] = (uVar350 != 0) * (uVar350 < 0x100) * cVar33 - (0xff < uVar350);
      auVar279._0_12_ = auVar275;
      cVar10 = (uVar352 != 0) * (uVar352 < 0x100) * cVar34 - (0xff < uVar352);
      auVar279[0xd] = cVar10;
      auVar287[0xe] = (uVar354 != 0) * (uVar354 < 0x100) * cVar35 - (0xff < uVar354);
      auVar287._0_14_ = auVar279;
      cVar9 = (uVar356 != 0) * (uVar356 < 0x100) * cVar36 - (0xff < uVar356);
      auVar287[0xf] = cVar9;
      uVar228 = (ushort)bVar15;
      uVar247 = (ushort)((uint)uVar303 >> 0x18);
      uVar249 = (ushort)((uint6)uVar304 >> 0x28);
      uVar250 = (ushort)((ulong)uVar305 >> 0x38);
      uVar251 = (ushort)((unkuint10)auVar329._0_10_ >> 0x48);
      uVar252 = auVar329._10_2_ >> 8;
      uVar253 = auVar333._12_2_ >> 8;
      uVar254 = auVar340._14_2_ >> 8;
      uVar324 = (ushort)bVar37;
      uVar344 = (ushort)((uint)uVar359 >> 0x18);
      uVar346 = (ushort)((uint6)uVar360 >> 0x28);
      uVar348 = (ushort)((ulong)uVar361 >> 0x38);
      uVar350 = (ushort)((unkuint10)auVar387._0_10_ >> 0x48);
      uVar352 = auVar387._10_2_ >> 8;
      uVar354 = auVar391._12_2_ >> 8;
      uVar356 = auVar398._14_2_ >> 8;
      bVar7 = (uVar247 != 0) * (uVar247 < 0x100) * cVar16 - (0xff < uVar247);
      cVar13 = (uVar250 != 0) * (uVar250 < 0x100) * cVar18 - (0xff < uVar250);
      uVar303 = CONCAT13(cVar13,CONCAT12((uVar249 != 0) * (uVar249 < 0x100) * cVar17 -
                                         (0xff < uVar249),
                                         CONCAT11(bVar7,(uVar228 != 0) * (uVar228 < 0x100) * bVar15
                                                        - (0xff < uVar228))));
      cVar14 = (uVar252 != 0) * (uVar252 < 0x100) * cVar20 - (0xff < uVar252);
      uVar304 = CONCAT15(cVar14,CONCAT14((uVar251 != 0) * (uVar251 < 0x100) * cVar19 -
                                         (0xff < uVar251),uVar303));
      cVar19 = (uVar254 != 0) * (uVar254 < 0x100) * cVar22 - (0xff < uVar254);
      uVar305 = CONCAT17(cVar19,CONCAT16((uVar253 != 0) * (uVar253 < 0x100) * cVar21 -
                                         (0xff < uVar253),uVar304));
      cVar22 = (uVar344 != 0) * (uVar344 < 0x100) * cVar38 - (0xff < uVar344);
      auVar330._0_10_ =
           CONCAT19(cVar22,CONCAT18((uVar324 != 0) * (uVar324 < 0x100) * bVar37 - (0xff < uVar324),
                                    uVar305));
      auVar330[10] = (uVar346 != 0) * (uVar346 < 0x100) * cVar39 - (0xff < uVar346);
      cVar21 = (uVar348 != 0) * (uVar348 < 0x100) * cVar40 - (0xff < uVar348);
      auVar330[0xb] = cVar21;
      auVar334[0xc] = (uVar350 != 0) * (uVar350 < 0x100) * cVar41 - (0xff < uVar350);
      auVar334._0_12_ = auVar330;
      cVar20 = (uVar352 != 0) * (uVar352 < 0x100) * cVar42 - (0xff < uVar352);
      auVar334[0xd] = cVar20;
      auVar341[0xe] = (uVar354 != 0) * (uVar354 < 0x100) * cVar43 - (0xff < uVar354);
      auVar341._0_14_ = auVar334;
      cVar18 = (uVar356 != 0) * (uVar356 < 0x100) * cVar44 - (0xff < uVar356);
      auVar341[0xf] = cVar18;
      auVar238 = auVar373 & auVar220;
      auVar283 = auVar315 & auVar220;
      sVar71 = auVar238._0_2_;
      sVar72 = auVar238._2_2_;
      bVar15 = (0 < sVar72) * (sVar72 < 0x100) * auVar238[2] - (0xff < sVar72);
      sVar72 = auVar238._4_2_;
      sVar76 = auVar238._6_2_;
      cVar17 = (0 < sVar76) * (sVar76 < 0x100) * auVar238[6] - (0xff < sVar76);
      uVar229 = CONCAT13(cVar17,CONCAT12((0 < sVar72) * (sVar72 < 0x100) * auVar238[4] -
                                         (0xff < sVar72),
                                         CONCAT11(bVar15,(0 < sVar71) * (sVar71 < 0x100) *
                                                         auVar238[0] - (0xff < sVar71))));
      sVar71 = auVar238._8_2_;
      sVar72 = auVar238._10_2_;
      cVar27 = (0 < sVar72) * (sVar72 < 0x100) * auVar238[10] - (0xff < sVar72);
      uVar230 = CONCAT15(cVar27,CONCAT14((0 < sVar71) * (sVar71 < 0x100) * auVar238[8] -
                                         (0xff < sVar71),uVar229));
      sVar71 = auVar238._12_2_;
      sVar72 = auVar238._14_2_;
      cVar26 = (0 < sVar72) * (sVar72 < 0x100) * auVar238[0xe] - (0xff < sVar72);
      uVar231 = CONCAT17(cVar26,CONCAT16((0 < sVar71) * (sVar71 < 0x100) * auVar238[0xc] -
                                         (0xff < sVar71),uVar230));
      sVar71 = auVar283._0_2_;
      sVar72 = auVar283._2_2_;
      cVar28 = (0 < sVar72) * (sVar72 < 0x100) * auVar283[2] - (0xff < sVar72);
      auVar233._0_10_ =
           CONCAT19(cVar28,CONCAT18((0 < sVar71) * (sVar71 < 0x100) * auVar283[0] - (0xff < sVar71),
                                    uVar231));
      sVar71 = auVar283._4_2_;
      auVar233[10] = (0 < sVar71) * (sVar71 < 0x100) * auVar283[4] - (0xff < sVar71);
      sVar71 = auVar283._6_2_;
      cVar25 = (0 < sVar71) * (sVar71 < 0x100) * auVar283[6] - (0xff < sVar71);
      auVar233[0xb] = cVar25;
      sVar71 = auVar283._8_2_;
      auVar236[0xc] = (0 < sVar71) * (sVar71 < 0x100) * auVar283[8] - (0xff < sVar71);
      auVar236._0_12_ = auVar233;
      sVar71 = auVar283._10_2_;
      cVar24 = (0 < sVar71) * (sVar71 < 0x100) * auVar283[10] - (0xff < sVar71);
      auVar236[0xd] = cVar24;
      sVar71 = auVar283._12_2_;
      auVar243[0xe] = (0 < sVar71) * (sVar71 < 0x100) * auVar283[0xc] - (0xff < sVar71);
      auVar243._0_14_ = auVar236;
      sVar71 = auVar283._14_2_;
      cVar16 = (0 < sVar71) * (sVar71 < 0x100) * auVar283[0xe] - (0xff < sVar71);
      auVar243[0xf] = cVar16;
      auVar283 = auVar423 & auVar220;
      auVar238 = auVar268 & auVar220;
      sVar71 = auVar283._0_2_;
      sVar72 = auVar283._2_2_;
      bVar300 = (0 < sVar72) * (sVar72 < 0x100) * auVar283[2] - (0xff < sVar72);
      sVar72 = auVar283._4_2_;
      sVar76 = auVar283._6_2_;
      cVar34 = (0 < sVar76) * (sVar76 < 0x100) * auVar283[6] - (0xff < sVar76);
      uVar426 = CONCAT13(cVar34,CONCAT12((0 < sVar72) * (sVar72 < 0x100) * auVar283[4] -
                                         (0xff < sVar72),
                                         CONCAT11(bVar300,(0 < sVar71) * (sVar71 < 0x100) *
                                                          auVar283[0] - (0xff < sVar71))));
      sVar71 = auVar283._8_2_;
      sVar72 = auVar283._10_2_;
      cVar36 = (0 < sVar72) * (sVar72 < 0x100) * auVar283[10] - (0xff < sVar72);
      uVar427 = CONCAT15(cVar36,CONCAT14((0 < sVar71) * (sVar71 < 0x100) * auVar283[8] -
                                         (0xff < sVar71),uVar426));
      sVar71 = auVar283._12_2_;
      sVar72 = auVar283._14_2_;
      cVar35 = (0 < sVar72) * (sVar72 < 0x100) * auVar283[0xe] - (0xff < sVar72);
      uVar428 = CONCAT17(cVar35,CONCAT16((0 < sVar71) * (sVar71 < 0x100) * auVar283[0xc] -
                                         (0xff < sVar71),uVar427));
      sVar71 = auVar238._0_2_;
      sVar72 = auVar238._2_2_;
      cVar33 = (0 < sVar72) * (sVar72 < 0x100) * auVar238[2] - (0xff < sVar72);
      auVar430._0_10_ =
           CONCAT19(cVar33,CONCAT18((0 < sVar71) * (sVar71 < 0x100) * auVar238[0] - (0xff < sVar71),
                                    uVar428));
      sVar71 = auVar238._4_2_;
      auVar430[10] = (0 < sVar71) * (sVar71 < 0x100) * auVar238[4] - (0xff < sVar71);
      sVar71 = auVar238._6_2_;
      cVar32 = (0 < sVar71) * (sVar71 < 0x100) * auVar238[6] - (0xff < sVar71);
      auVar430[0xb] = cVar32;
      sVar71 = auVar238._8_2_;
      auVar432[0xc] = (0 < sVar71) * (sVar71 < 0x100) * auVar238[8] - (0xff < sVar71);
      auVar432._0_12_ = auVar430;
      sVar71 = auVar238._10_2_;
      cVar31 = (0 < sVar71) * (sVar71 < 0x100) * auVar238[10] - (0xff < sVar71);
      auVar432[0xd] = cVar31;
      sVar71 = auVar238._12_2_;
      auVar435[0xe] = (0 < sVar71) * (sVar71 < 0x100) * auVar238[0xc] - (0xff < sVar71);
      auVar435._0_14_ = auVar432;
      sVar71 = auVar238._14_2_;
      cVar30 = (0 < sVar71) * (sVar71 < 0x100) * auVar238[0xe] - (0xff < sVar71);
      auVar435[0xf] = cVar30;
      auVar283 = auVar287 & auVar220;
      auVar238 = auVar341 & auVar220;
      sVar71 = auVar283._0_2_;
      sVar72 = auVar283._2_2_;
      bVar29 = (0 < sVar72) * (sVar72 < 0x100) * auVar283[2] - (0xff < sVar72);
      sVar72 = auVar283._4_2_;
      sVar76 = auVar283._6_2_;
      cVar38 = (0 < sVar76) * (sVar76 < 0x100) * auVar283[6] - (0xff < sVar76);
      uVar384 = CONCAT13(cVar38,CONCAT12((0 < sVar72) * (sVar72 < 0x100) * auVar283[4] -
                                         (0xff < sVar72),
                                         CONCAT11(bVar29,(0 < sVar71) * (sVar71 < 0x100) *
                                                         auVar283[0] - (0xff < sVar71))));
      sVar71 = auVar283._8_2_;
      sVar72 = auVar283._10_2_;
      cVar44 = (0 < sVar72) * (sVar72 < 0x100) * auVar283[10] - (0xff < sVar72);
      uVar385 = CONCAT15(cVar44,CONCAT14((0 < sVar71) * (sVar71 < 0x100) * auVar283[8] -
                                         (0xff < sVar71),uVar384));
      sVar71 = auVar283._12_2_;
      sVar72 = auVar283._14_2_;
      cVar43 = (0 < sVar72) * (sVar72 < 0x100) * auVar283[0xe] - (0xff < sVar72);
      uVar386 = CONCAT17(cVar43,CONCAT16((0 < sVar71) * (sVar71 < 0x100) * auVar283[0xc] -
                                         (0xff < sVar71),uVar385));
      sVar71 = auVar238._0_2_;
      sVar72 = auVar238._2_2_;
      cVar42 = (0 < sVar72) * (sVar72 < 0x100) * auVar238[2] - (0xff < sVar72);
      auVar388._0_10_ =
           CONCAT19(cVar42,CONCAT18((0 < sVar71) * (sVar71 < 0x100) * auVar238[0] - (0xff < sVar71),
                                    uVar386));
      sVar71 = auVar238._4_2_;
      auVar388[10] = (0 < sVar71) * (sVar71 < 0x100) * auVar238[4] - (0xff < sVar71);
      sVar71 = auVar238._6_2_;
      cVar41 = (0 < sVar71) * (sVar71 < 0x100) * auVar238[6] - (0xff < sVar71);
      auVar388[0xb] = cVar41;
      sVar71 = auVar238._8_2_;
      auVar392[0xc] = (0 < sVar71) * (sVar71 < 0x100) * auVar238[8] - (0xff < sVar71);
      auVar392._0_12_ = auVar388;
      sVar71 = auVar238._10_2_;
      cVar40 = (0 < sVar71) * (sVar71 < 0x100) * auVar238[10] - (0xff < sVar71);
      auVar392[0xd] = cVar40;
      sVar71 = auVar238._12_2_;
      auVar399[0xe] = (0 < sVar71) * (sVar71 < 0x100) * auVar238[0xc] - (0xff < sVar71);
      auVar399._0_14_ = auVar392;
      sVar71 = auVar238._14_2_;
      cVar39 = (0 < sVar71) * (sVar71 < 0x100) * auVar238[0xe] - (0xff < sVar71);
      auVar399[0xf] = cVar39;
      uVar324 = (ushort)bVar45;
      uVar344 = (ushort)((uint)uVar326 >> 0x18);
      uVar346 = (ushort)((uint6)uVar327 >> 0x28);
      uVar348 = (ushort)((ulong)uVar328 >> 0x38);
      uVar350 = (ushort)((unkuint10)auVar362._0_10_ >> 0x48);
      uVar352 = auVar362._10_2_ >> 8;
      uVar354 = auVar365._12_2_ >> 8;
      uVar356 = auVar373._14_2_ >> 8;
      uVar228 = (ushort)bVar53;
      uVar247 = (ushort)((uint)uVar290 >> 0x18);
      uVar249 = (ushort)((uint6)uVar291 >> 0x28);
      uVar250 = (ushort)((ulong)uVar292 >> 0x38);
      uVar251 = (ushort)((unkuint10)auVar306._0_10_ >> 0x48);
      uVar252 = auVar306._10_2_ >> 8;
      uVar253 = auVar308._12_2_ >> 8;
      uVar254 = auVar315._14_2_ >> 8;
      bVar37 = (uVar344 != 0) * (uVar344 < 0x100) * cVar46 - (0xff < uVar344);
      cVar46 = (uVar348 != 0) * (uVar348 < 0x100) * cVar48 - (0xff < uVar348);
      uVar359 = CONCAT13(cVar46,CONCAT12((uVar346 != 0) * (uVar346 < 0x100) * cVar47 -
                                         (0xff < uVar346),
                                         CONCAT11(bVar37,(uVar324 != 0) * (uVar324 < 0x100) * bVar45
                                                         - (0xff < uVar324))));
      cVar47 = (uVar352 != 0) * (uVar352 < 0x100) * cVar50 - (0xff < uVar352);
      uVar360 = CONCAT15(cVar47,CONCAT14((uVar350 != 0) * (uVar350 < 0x100) * cVar49 -
                                         (0xff < uVar350),uVar359));
      cVar50 = (uVar356 != 0) * (uVar356 < 0x100) * cVar52 - (0xff < uVar356);
      uVar361 = CONCAT17(cVar50,CONCAT16((uVar354 != 0) * (uVar354 < 0x100) * cVar51 -
                                         (0xff < uVar354),uVar360));
      cVar49 = (uVar247 != 0) * (uVar247 < 0x100) * cVar54 - (0xff < uVar247);
      auVar363._0_10_ =
           CONCAT19(cVar49,CONCAT18((uVar228 != 0) * (uVar228 < 0x100) * bVar53 - (0xff < uVar228),
                                    uVar361));
      auVar363[10] = (uVar249 != 0) * (uVar249 < 0x100) * cVar55 - (0xff < uVar249);
      cVar51 = (uVar250 != 0) * (uVar250 < 0x100) * cVar56 - (0xff < uVar250);
      auVar363[0xb] = cVar51;
      auVar366[0xc] = (uVar251 != 0) * (uVar251 < 0x100) * cVar57 - (0xff < uVar251);
      auVar366._0_12_ = auVar363;
      cVar52 = (uVar252 != 0) * (uVar252 < 0x100) * cVar58 - (0xff < uVar252);
      auVar366[0xd] = cVar52;
      auVar374[0xe] = (uVar253 != 0) * (uVar253 < 0x100) * cVar59 - (0xff < uVar253);
      auVar374._0_14_ = auVar366;
      cVar48 = (uVar254 != 0) * (uVar254 < 0x100) * cVar60 - (0xff < uVar254);
      auVar374[0xf] = cVar48;
      uVar324 = (ushort)bVar61;
      uVar344 = (ushort)((uint)uVar409 >> 0x18);
      uVar346 = (ushort)((uint6)uVar410 >> 0x28);
      uVar348 = (ushort)((ulong)uVar411 >> 0x38);
      uVar350 = (ushort)((unkuint10)auVar412._0_10_ >> 0x48);
      uVar352 = auVar412._10_2_ >> 8;
      uVar354 = auVar415._12_2_ >> 8;
      uVar356 = auVar423._14_2_ >> 8;
      uVar228 = (ushort)bVar69;
      uVar247 = (ushort)((uint)uVar255 >> 0x18);
      uVar249 = (ushort)((uint6)uVar256 >> 0x28);
      uVar250 = (ushort)((ulong)uVar257 >> 0x38);
      uVar251 = (ushort)((unkuint10)auVar259._0_10_ >> 0x48);
      uVar252 = auVar259._10_2_ >> 8;
      uVar253 = auVar263._12_2_ >> 8;
      uVar254 = auVar268._14_2_ >> 8;
      bVar45 = (uVar344 != 0) * (uVar344 < 0x100) * cVar62 - (0xff < uVar344);
      cVar54 = (uVar348 != 0) * (uVar348 < 0x100) * cVar64 - (0xff < uVar348);
      uVar409 = CONCAT13(cVar54,CONCAT12((uVar346 != 0) * (uVar346 < 0x100) * cVar63 -
                                         (0xff < uVar346),
                                         CONCAT11(bVar45,(uVar324 != 0) * (uVar324 < 0x100) * bVar61
                                                         - (0xff < uVar324))));
      cVar55 = (uVar352 != 0) * (uVar352 < 0x100) * cVar66 - (0xff < uVar352);
      uVar410 = CONCAT15(cVar55,CONCAT14((uVar350 != 0) * (uVar350 < 0x100) * cVar65 -
                                         (0xff < uVar350),uVar409));
      cVar56 = (uVar356 != 0) * (uVar356 < 0x100) * cVar68 - (0xff < uVar356);
      uVar411 = CONCAT17(cVar56,CONCAT16((uVar354 != 0) * (uVar354 < 0x100) * cVar67 -
                                         (0xff < uVar354),uVar410));
      cVar1 = (uVar247 != 0) * (uVar247 < 0x100) * cVar1 - (0xff < uVar247);
      auVar413._0_10_ =
           CONCAT19(cVar1,CONCAT18((uVar228 != 0) * (uVar228 < 0x100) * bVar69 - (0xff < uVar228),
                                   uVar411));
      auVar413[10] = (uVar249 != 0) * (uVar249 < 0x100) * cVar246 - (0xff < uVar249);
      cVar246 = (uVar250 != 0) * (uVar250 < 0x100) * cVar6 - (0xff < uVar250);
      auVar413[0xb] = cVar246;
      auVar416[0xc] = (uVar251 != 0) * (uVar251 < 0x100) * cVar5 - (0xff < uVar251);
      auVar416._0_12_ = auVar413;
      cVar6 = (uVar252 != 0) * (uVar252 < 0x100) * cVar3 - (0xff < uVar252);
      auVar416[0xd] = cVar6;
      auVar424[0xe] = (uVar253 != 0) * (uVar253 < 0x100) * cVar2 - (0xff < uVar253);
      auVar424._0_14_ = auVar416;
      cVar5 = (uVar254 != 0) * (uVar254 < 0x100) * cVar4 - (0xff < uVar254);
      auVar424[0xf] = cVar5;
      uVar228 = (ushort)bVar248;
      uVar247 = (ushort)((uint)uVar271 >> 0x18);
      uVar249 = (ushort)((uint6)uVar272 >> 0x28);
      uVar250 = (ushort)((ulong)uVar273 >> 0x38);
      uVar251 = (ushort)((unkuint10)auVar275._0_10_ >> 0x48);
      uVar252 = auVar275._10_2_ >> 8;
      uVar253 = auVar279._12_2_ >> 8;
      uVar254 = auVar287._14_2_ >> 8;
      uVar324 = (ushort)bVar7;
      uVar344 = (ushort)((uint)uVar303 >> 0x18);
      uVar346 = (ushort)((uint6)uVar304 >> 0x28);
      uVar348 = (ushort)((ulong)uVar305 >> 0x38);
      uVar350 = (ushort)((unkuint10)auVar330._0_10_ >> 0x48);
      uVar352 = auVar330._10_2_ >> 8;
      uVar354 = auVar334._12_2_ >> 8;
      uVar356 = auVar341._14_2_ >> 8;
      bVar53 = (uVar247 != 0) * (uVar247 < 0x100) * cVar23 - (0xff < uVar247);
      cVar23 = (uVar250 != 0) * (uVar250 < 0x100) * cVar12 - (0xff < uVar250);
      uVar271 = CONCAT13(cVar23,CONCAT12((uVar249 != 0) * (uVar249 < 0x100) * cVar299 -
                                         (0xff < uVar249),
                                         CONCAT11(bVar53,(uVar228 != 0) * (uVar228 < 0x100) *
                                                         bVar248 - (0xff < uVar228))));
      cVar12 = (uVar252 != 0) * (uVar252 < 0x100) * cVar8 - (0xff < uVar252);
      uVar272 = CONCAT15(cVar12,CONCAT14((uVar251 != 0) * (uVar251 < 0x100) * cVar11 -
                                         (0xff < uVar251),uVar271));
      cVar9 = (uVar254 != 0) * (uVar254 < 0x100) * cVar9 - (0xff < uVar254);
      uVar273 = CONCAT17(cVar9,CONCAT16((uVar253 != 0) * (uVar253 < 0x100) * cVar10 -
                                        (0xff < uVar253),uVar272));
      cVar3 = (uVar344 != 0) * (uVar344 < 0x100) * cVar13 - (0xff < uVar344);
      auVar276._0_10_ =
           CONCAT19(cVar3,CONCAT18((uVar324 != 0) * (uVar324 < 0x100) * bVar7 - (0xff < uVar324),
                                   uVar273));
      auVar276[10] = (uVar346 != 0) * (uVar346 < 0x100) * cVar14 - (0xff < uVar346);
      cVar8 = (uVar348 != 0) * (uVar348 < 0x100) * cVar19 - (0xff < uVar348);
      auVar276[0xb] = cVar8;
      auVar280[0xc] = (uVar350 != 0) * (uVar350 < 0x100) * cVar22 - (0xff < uVar350);
      auVar280._0_12_ = auVar276;
      cVar4 = (uVar352 != 0) * (uVar352 < 0x100) * cVar21 - (0xff < uVar352);
      auVar280[0xd] = cVar4;
      auVar288[0xe] = (uVar354 != 0) * (uVar354 < 0x100) * cVar20 - (0xff < uVar354);
      auVar288._0_14_ = auVar280;
      cVar2 = (uVar356 != 0) * (uVar356 < 0x100) * cVar18 - (0xff < uVar356);
      auVar288[0xf] = cVar2;
      auVar238 = auVar243 & auVar220;
      auVar283 = auVar435 & auVar220;
      sVar71 = auVar238._0_2_;
      sVar72 = auVar238._2_2_;
      bVar248 = (0 < sVar72) * (sVar72 < 0x100) * auVar238[2] - (0xff < sVar72);
      sVar72 = auVar238._4_2_;
      sVar76 = auVar238._6_2_;
      cVar10 = (0 < sVar76) * (sVar76 < 0x100) * auVar238[6] - (0xff < sVar76);
      uVar255 = CONCAT13(cVar10,CONCAT12((0 < sVar72) * (sVar72 < 0x100) * auVar238[4] -
                                         (0xff < sVar72),
                                         CONCAT11(bVar248,(0 < sVar71) * (sVar71 < 0x100) *
                                                          auVar238[0] - (0xff < sVar71))));
      sVar71 = auVar238._8_2_;
      sVar72 = auVar238._10_2_;
      cVar11 = (0 < sVar72) * (sVar72 < 0x100) * auVar238[10] - (0xff < sVar72);
      uVar256 = CONCAT15(cVar11,CONCAT14((0 < sVar71) * (sVar71 < 0x100) * auVar238[8] -
                                         (0xff < sVar71),uVar255));
      sVar71 = auVar238._12_2_;
      sVar72 = auVar238._14_2_;
      cVar13 = (0 < sVar72) * (sVar72 < 0x100) * auVar238[0xe] - (0xff < sVar72);
      uVar257 = CONCAT17(cVar13,CONCAT16((0 < sVar71) * (sVar71 < 0x100) * auVar238[0xc] -
                                         (0xff < sVar71),uVar256));
      sVar71 = auVar283._0_2_;
      sVar72 = auVar283._2_2_;
      cVar14 = (0 < sVar72) * (sVar72 < 0x100) * auVar283[2] - (0xff < sVar72);
      auVar260._0_10_ =
           CONCAT19(cVar14,CONCAT18((0 < sVar71) * (sVar71 < 0x100) * auVar283[0] - (0xff < sVar71),
                                    uVar257));
      sVar71 = auVar283._4_2_;
      auVar260[10] = (0 < sVar71) * (sVar71 < 0x100) * auVar283[4] - (0xff < sVar71);
      sVar71 = auVar283._6_2_;
      cVar19 = (0 < sVar71) * (sVar71 < 0x100) * auVar283[6] - (0xff < sVar71);
      auVar260[0xb] = cVar19;
      sVar71 = auVar283._8_2_;
      auVar264[0xc] = (0 < sVar71) * (sVar71 < 0x100) * auVar283[8] - (0xff < sVar71);
      auVar264._0_12_ = auVar260;
      sVar71 = auVar283._10_2_;
      cVar22 = (0 < sVar71) * (sVar71 < 0x100) * auVar283[10] - (0xff < sVar71);
      auVar264[0xd] = cVar22;
      sVar71 = auVar283._12_2_;
      auVar269[0xe] = (0 < sVar71) * (sVar71 < 0x100) * auVar283[0xc] - (0xff < sVar71);
      auVar269._0_14_ = auVar264;
      sVar71 = auVar283._14_2_;
      cVar21 = (0 < sVar71) * (sVar71 < 0x100) * auVar283[0xe] - (0xff < sVar71);
      auVar269[0xf] = cVar21;
      auVar238 = auVar399 & auVar220;
      auVar283 = auVar374 & auVar220;
      sVar71 = auVar238._0_2_;
      sVar72 = auVar238._2_2_;
      bVar7 = (0 < sVar72) * (sVar72 < 0x100) * auVar238[2] - (0xff < sVar72);
      sVar72 = auVar238._4_2_;
      sVar76 = auVar238._6_2_;
      cVar60 = (0 < sVar76) * (sVar76 < 0x100) * auVar238[6] - (0xff < sVar76);
      uVar290 = CONCAT13(cVar60,CONCAT12((0 < sVar72) * (sVar72 < 0x100) * auVar238[4] -
                                         (0xff < sVar72),
                                         CONCAT11(bVar7,(0 < sVar71) * (sVar71 < 0x100) *
                                                        auVar238[0] - (0xff < sVar71))));
      sVar71 = auVar238._8_2_;
      sVar72 = auVar238._10_2_;
      cVar59 = (0 < sVar72) * (sVar72 < 0x100) * auVar238[10] - (0xff < sVar72);
      uVar291 = CONCAT15(cVar59,CONCAT14((0 < sVar71) * (sVar71 < 0x100) * auVar238[8] -
                                         (0xff < sVar71),uVar290));
      sVar71 = auVar238._12_2_;
      sVar72 = auVar238._14_2_;
      cVar58 = (0 < sVar72) * (sVar72 < 0x100) * auVar238[0xe] - (0xff < sVar72);
      uVar292 = CONCAT17(cVar58,CONCAT16((0 < sVar71) * (sVar71 < 0x100) * auVar238[0xc] -
                                         (0xff < sVar71),uVar291));
      sVar71 = auVar283._0_2_;
      sVar72 = auVar283._2_2_;
      cVar20 = (0 < sVar72) * (sVar72 < 0x100) * auVar283[2] - (0xff < sVar72);
      auVar293._0_10_ =
           CONCAT19(cVar20,CONCAT18((0 < sVar71) * (sVar71 < 0x100) * auVar283[0] - (0xff < sVar71),
                                    uVar292));
      sVar71 = auVar283._4_2_;
      auVar293[10] = (0 < sVar71) * (sVar71 < 0x100) * auVar283[4] - (0xff < sVar71);
      sVar71 = auVar283._6_2_;
      cVar57 = (0 < sVar71) * (sVar71 < 0x100) * auVar283[6] - (0xff < sVar71);
      auVar293[0xb] = cVar57;
      sVar71 = auVar283._8_2_;
      auVar294[0xc] = (0 < sVar71) * (sVar71 < 0x100) * auVar283[8] - (0xff < sVar71);
      auVar294._0_12_ = auVar293;
      sVar71 = auVar283._10_2_;
      cVar299 = (0 < sVar71) * (sVar71 < 0x100) * auVar283[10] - (0xff < sVar71);
      auVar294[0xd] = cVar299;
      sVar71 = auVar283._12_2_;
      auVar298[0xe] = (0 < sVar71) * (sVar71 < 0x100) * auVar283[0xc] - (0xff < sVar71);
      auVar298._0_14_ = auVar294;
      sVar71 = auVar283._14_2_;
      cVar18 = (0 < sVar71) * (sVar71 < 0x100) * auVar283[0xe] - (0xff < sVar71);
      auVar298[0xf] = cVar18;
      auVar283 = auVar424 & auVar220;
      auVar238 = auVar288 & auVar220;
      sVar71 = auVar283._0_2_;
      sVar72 = auVar283._2_2_;
      bVar61 = (0 < sVar72) * (sVar72 < 0x100) * auVar283[2] - (0xff < sVar72);
      sVar72 = auVar283._4_2_;
      sVar76 = auVar283._6_2_;
      cVar66 = (0 < sVar76) * (sVar76 < 0x100) * auVar283[6] - (0xff < sVar76);
      uVar326 = CONCAT13(cVar66,CONCAT12((0 < sVar72) * (sVar72 < 0x100) * auVar283[4] -
                                         (0xff < sVar72),
                                         CONCAT11(bVar61,(0 < sVar71) * (sVar71 < 0x100) *
                                                         auVar283[0] - (0xff < sVar71))));
      sVar71 = auVar283._8_2_;
      sVar72 = auVar283._10_2_;
      cVar67 = (0 < sVar72) * (sVar72 < 0x100) * auVar283[10] - (0xff < sVar72);
      uVar327 = CONCAT15(cVar67,CONCAT14((0 < sVar71) * (sVar71 < 0x100) * auVar283[8] -
                                         (0xff < sVar71),uVar326));
      sVar71 = auVar283._12_2_;
      sVar72 = auVar283._14_2_;
      cVar68 = (0 < sVar72) * (sVar72 < 0x100) * auVar283[0xe] - (0xff < sVar72);
      uVar328 = CONCAT17(cVar68,CONCAT16((0 < sVar71) * (sVar71 < 0x100) * auVar283[0xc] -
                                         (0xff < sVar71),uVar327));
      sVar71 = auVar238._0_2_;
      sVar72 = auVar238._2_2_;
      cVar62 = (0 < sVar72) * (sVar72 < 0x100) * auVar238[2] - (0xff < sVar72);
      auVar331._0_10_ =
           CONCAT19(cVar62,CONCAT18((0 < sVar71) * (sVar71 < 0x100) * auVar238[0] - (0xff < sVar71),
                                    uVar328));
      sVar71 = auVar238._4_2_;
      auVar331[10] = (0 < sVar71) * (sVar71 < 0x100) * auVar238[4] - (0xff < sVar71);
      sVar71 = auVar238._6_2_;
      cVar64 = (0 < sVar71) * (sVar71 < 0x100) * auVar238[6] - (0xff < sVar71);
      auVar331[0xb] = cVar64;
      sVar71 = auVar238._8_2_;
      auVar335[0xc] = (0 < sVar71) * (sVar71 < 0x100) * auVar238[8] - (0xff < sVar71);
      auVar335._0_12_ = auVar331;
      sVar71 = auVar238._10_2_;
      cVar63 = (0 < sVar71) * (sVar71 < 0x100) * auVar238[10] - (0xff < sVar71);
      auVar335[0xd] = cVar63;
      sVar71 = auVar238._12_2_;
      auVar342[0xe] = (0 < sVar71) * (sVar71 < 0x100) * auVar238[0xc] - (0xff < sVar71);
      auVar342._0_14_ = auVar335;
      sVar71 = auVar238._14_2_;
      cVar65 = (0 < sVar71) * (sVar71 < 0x100) * auVar238[0xe] - (0xff < sVar71);
      auVar342[0xf] = cVar65;
      uVar228 = (ushort)bVar15;
      uVar247 = (ushort)((uint)uVar229 >> 0x18);
      uVar249 = (ushort)((uint6)uVar230 >> 0x28);
      uVar250 = (ushort)((ulong)uVar231 >> 0x38);
      uVar251 = (ushort)((unkuint10)auVar233._0_10_ >> 0x48);
      uVar252 = auVar233._10_2_ >> 8;
      uVar253 = auVar236._12_2_ >> 8;
      uVar254 = auVar243._14_2_ >> 8;
      uVar324 = (ushort)bVar300;
      uVar344 = (ushort)((uint)uVar426 >> 0x18);
      uVar346 = (ushort)((uint6)uVar427 >> 0x28);
      uVar348 = (ushort)((ulong)uVar428 >> 0x38);
      uVar350 = (ushort)((unkuint10)auVar430._0_10_ >> 0x48);
      uVar352 = auVar430._10_2_ >> 8;
      uVar354 = auVar432._12_2_ >> 8;
      uVar356 = auVar435._14_2_ >> 8;
      bVar69 = (uVar247 != 0) * (uVar247 < 0x100) * cVar17 - (0xff < uVar247);
      cVar70 = (uVar250 != 0) * (uVar250 < 0x100) * cVar26 - (0xff < uVar250);
      uVar229 = CONCAT13(cVar70,CONCAT12((uVar249 != 0) * (uVar249 < 0x100) * cVar27 -
                                         (0xff < uVar249),
                                         CONCAT11(bVar69,(uVar228 != 0) * (uVar228 < 0x100) * bVar15
                                                         - (0xff < uVar228))));
      cVar27 = (uVar252 != 0) * (uVar252 < 0x100) * cVar25 - (0xff < uVar252);
      uVar230 = CONCAT15(cVar27,CONCAT14((uVar251 != 0) * (uVar251 < 0x100) * cVar28 -
                                         (0xff < uVar251),uVar229));
      cVar26 = (uVar254 != 0) * (uVar254 < 0x100) * cVar16 - (0xff < uVar254);
      uVar231 = CONCAT17(cVar26,CONCAT16((uVar253 != 0) * (uVar253 < 0x100) * cVar24 -
                                         (0xff < uVar253),uVar230));
      cVar25 = (uVar344 != 0) * (uVar344 < 0x100) * cVar34 - (0xff < uVar344);
      auVar234._0_10_ =
           CONCAT19(cVar25,CONCAT18((uVar324 != 0) * (uVar324 < 0x100) * bVar300 - (0xff < uVar324),
                                    uVar231));
      auVar234[10] = (uVar346 != 0) * (uVar346 < 0x100) * cVar36 - (0xff < uVar346);
      cVar17 = (uVar348 != 0) * (uVar348 < 0x100) * cVar35 - (0xff < uVar348);
      auVar234[0xb] = cVar17;
      auVar237[0xc] = (uVar350 != 0) * (uVar350 < 0x100) * cVar33 - (0xff < uVar350);
      auVar237._0_12_ = auVar234;
      cVar24 = (uVar352 != 0) * (uVar352 < 0x100) * cVar32 - (0xff < uVar352);
      auVar237[0xd] = cVar24;
      auVar244[0xe] = (uVar354 != 0) * (uVar354 < 0x100) * cVar31 - (0xff < uVar354);
      auVar244._0_14_ = auVar237;
      cVar16 = (uVar356 != 0) * (uVar356 < 0x100) * cVar30 - (0xff < uVar356);
      auVar244[0xf] = cVar16;
      uVar324 = (ushort)bVar29;
      uVar344 = (ushort)((uint)uVar384 >> 0x18);
      uVar346 = (ushort)((uint6)uVar385 >> 0x28);
      uVar348 = (ushort)((ulong)uVar386 >> 0x38);
      uVar350 = (ushort)((unkuint10)auVar388._0_10_ >> 0x48);
      uVar352 = auVar388._10_2_ >> 8;
      uVar354 = auVar392._12_2_ >> 8;
      uVar356 = auVar399._14_2_ >> 8;
      uVar228 = (ushort)bVar37;
      uVar247 = (ushort)((uint)uVar359 >> 0x18);
      uVar249 = (ushort)((uint6)uVar360 >> 0x28);
      uVar250 = (ushort)((ulong)uVar361 >> 0x38);
      uVar251 = (ushort)((unkuint10)auVar363._0_10_ >> 0x48);
      uVar252 = auVar363._10_2_ >> 8;
      uVar253 = auVar366._12_2_ >> 8;
      uVar254 = auVar374._14_2_ >> 8;
      bVar15 = (uVar344 != 0) * (uVar344 < 0x100) * cVar38 - (0xff < uVar344);
      cVar28 = (uVar348 != 0) * (uVar348 < 0x100) * cVar43 - (0xff < uVar348);
      uVar384 = CONCAT13(cVar28,CONCAT12((uVar346 != 0) * (uVar346 < 0x100) * cVar44 -
                                         (0xff < uVar346),
                                         CONCAT11(bVar15,(uVar324 != 0) * (uVar324 < 0x100) * bVar29
                                                         - (0xff < uVar324))));
      cVar34 = (uVar352 != 0) * (uVar352 < 0x100) * cVar41 - (0xff < uVar352);
      uVar385 = CONCAT15(cVar34,CONCAT14((uVar350 != 0) * (uVar350 < 0x100) * cVar42 -
                                         (0xff < uVar350),uVar384));
      cVar36 = (uVar356 != 0) * (uVar356 < 0x100) * cVar39 - (0xff < uVar356);
      uVar386 = CONCAT17(cVar36,CONCAT16((uVar354 != 0) * (uVar354 < 0x100) * cVar40 -
                                         (0xff < uVar354),uVar385));
      cVar35 = (uVar247 != 0) * (uVar247 < 0x100) * cVar46 - (0xff < uVar247);
      auVar389._0_10_ =
           CONCAT19(cVar35,CONCAT18((uVar228 != 0) * (uVar228 < 0x100) * bVar37 - (0xff < uVar228),
                                    uVar386));
      auVar389[10] = (uVar249 != 0) * (uVar249 < 0x100) * cVar47 - (0xff < uVar249);
      cVar33 = (uVar250 != 0) * (uVar250 < 0x100) * cVar50 - (0xff < uVar250);
      auVar389[0xb] = cVar33;
      auVar393[0xc] = (uVar251 != 0) * (uVar251 < 0x100) * cVar49 - (0xff < uVar251);
      auVar393._0_12_ = auVar389;
      cVar32 = (uVar252 != 0) * (uVar252 < 0x100) * cVar51 - (0xff < uVar252);
      auVar393[0xd] = cVar32;
      auVar400[0xe] = (uVar253 != 0) * (uVar253 < 0x100) * cVar52 - (0xff < uVar253);
      auVar400._0_14_ = auVar393;
      cVar31 = (uVar254 != 0) * (uVar254 < 0x100) * cVar48 - (0xff < uVar254);
      auVar400[0xf] = cVar31;
      uVar324 = (ushort)bVar45;
      uVar344 = (ushort)((uint)uVar409 >> 0x18);
      uVar346 = (ushort)((uint6)uVar410 >> 0x28);
      uVar348 = (ushort)((ulong)uVar411 >> 0x38);
      uVar350 = (ushort)((unkuint10)auVar413._0_10_ >> 0x48);
      uVar352 = auVar413._10_2_ >> 8;
      uVar354 = auVar416._12_2_ >> 8;
      uVar356 = auVar424._14_2_ >> 8;
      uVar228 = (ushort)bVar53;
      uVar247 = (ushort)((uint)uVar271 >> 0x18);
      uVar249 = (ushort)((uint6)uVar272 >> 0x28);
      uVar250 = (ushort)((ulong)uVar273 >> 0x38);
      uVar251 = (ushort)((unkuint10)auVar276._0_10_ >> 0x48);
      uVar252 = auVar276._10_2_ >> 8;
      uVar253 = auVar280._12_2_ >> 8;
      uVar254 = auVar288._14_2_ >> 8;
      bVar300 = (uVar344 != 0) * (uVar344 < 0x100) * cVar54 - (0xff < uVar344);
      cVar38 = (uVar348 != 0) * (uVar348 < 0x100) * cVar56 - (0xff < uVar348);
      uVar409 = CONCAT13(cVar38,CONCAT12((uVar346 != 0) * (uVar346 < 0x100) * cVar55 -
                                         (0xff < uVar346),
                                         CONCAT11(bVar300,(uVar324 != 0) * (uVar324 < 0x100) *
                                                          bVar45 - (0xff < uVar324))));
      cVar30 = (uVar352 != 0) * (uVar352 < 0x100) * cVar246 - (0xff < uVar352);
      uVar410 = CONCAT15(cVar30,CONCAT14((uVar350 != 0) * (uVar350 < 0x100) * cVar1 -
                                         (0xff < uVar350),uVar409));
      cVar246 = (uVar356 != 0) * (uVar356 < 0x100) * cVar5 - (0xff < uVar356);
      uVar411 = CONCAT17(cVar246,CONCAT16((uVar354 != 0) * (uVar354 < 0x100) * cVar6 -
                                          (0xff < uVar354),uVar410));
      cVar23 = (uVar247 != 0) * (uVar247 < 0x100) * cVar23 - (0xff < uVar247);
      auVar414._0_10_ =
           CONCAT19(cVar23,CONCAT18((uVar228 != 0) * (uVar228 < 0x100) * bVar53 - (0xff < uVar228),
                                    uVar411));
      auVar414[10] = (uVar249 != 0) * (uVar249 < 0x100) * cVar12 - (0xff < uVar249);
      cVar5 = (uVar250 != 0) * (uVar250 < 0x100) * cVar9 - (0xff < uVar250);
      auVar414[0xb] = cVar5;
      auVar417[0xc] = (uVar251 != 0) * (uVar251 < 0x100) * cVar3 - (0xff < uVar251);
      auVar417._0_12_ = auVar414;
      cVar6 = (uVar252 != 0) * (uVar252 < 0x100) * cVar8 - (0xff < uVar252);
      auVar417[0xd] = cVar6;
      auVar425[0xe] = (uVar253 != 0) * (uVar253 < 0x100) * cVar4 - (0xff < uVar253);
      auVar425._0_14_ = auVar417;
      cVar1 = (uVar254 != 0) * (uVar254 < 0x100) * cVar2 - (0xff < uVar254);
      auVar425[0xf] = cVar1;
      auVar283 = auVar269 & auVar220;
      auVar238 = auVar298 & auVar220;
      sVar71 = auVar283._0_2_;
      sVar72 = auVar283._2_2_;
      bVar29 = (0 < sVar72) * (sVar72 < 0x100) * auVar283[2] - (0xff < sVar72);
      sVar72 = auVar283._4_2_;
      sVar76 = auVar283._6_2_;
      cVar3 = (0 < sVar76) * (sVar76 < 0x100) * auVar283[6] - (0xff < sVar76);
      uVar303 = CONCAT13(cVar3,CONCAT12((0 < sVar72) * (sVar72 < 0x100) * auVar283[4] -
                                        (0xff < sVar72),
                                        CONCAT11(bVar29,(0 < sVar71) * (sVar71 < 0x100) *
                                                        auVar283[0] - (0xff < sVar71))));
      sVar71 = auVar283._8_2_;
      sVar72 = auVar283._10_2_;
      cVar2 = (0 < sVar72) * (sVar72 < 0x100) * auVar283[10] - (0xff < sVar72);
      uVar304 = CONCAT15(cVar2,CONCAT14((0 < sVar71) * (sVar71 < 0x100) * auVar283[8] -
                                        (0xff < sVar71),uVar303));
      sVar71 = auVar283._12_2_;
      sVar72 = auVar283._14_2_;
      cVar4 = (0 < sVar72) * (sVar72 < 0x100) * auVar283[0xe] - (0xff < sVar72);
      uVar305 = CONCAT17(cVar4,CONCAT16((0 < sVar71) * (sVar71 < 0x100) * auVar283[0xc] -
                                        (0xff < sVar71),uVar304));
      sVar71 = auVar238._0_2_;
      sVar72 = auVar238._2_2_;
      cVar8 = (0 < sVar72) * (sVar72 < 0x100) * auVar238[2] - (0xff < sVar72);
      auVar307._0_10_ =
           CONCAT19(cVar8,CONCAT18((0 < sVar71) * (sVar71 < 0x100) * auVar238[0] - (0xff < sVar71),
                                   uVar305));
      sVar71 = auVar238._4_2_;
      auVar307[10] = (0 < sVar71) * (sVar71 < 0x100) * auVar238[4] - (0xff < sVar71);
      sVar71 = auVar238._6_2_;
      cVar9 = (0 < sVar71) * (sVar71 < 0x100) * auVar238[6] - (0xff < sVar71);
      auVar307[0xb] = cVar9;
      sVar71 = auVar238._8_2_;
      auVar309[0xc] = (0 < sVar71) * (sVar71 < 0x100) * auVar238[8] - (0xff < sVar71);
      auVar309._0_12_ = auVar307;
      sVar71 = auVar238._10_2_;
      cVar12 = (0 < sVar71) * (sVar71 < 0x100) * auVar238[10] - (0xff < sVar71);
      auVar309[0xd] = cVar12;
      sVar71 = auVar238._12_2_;
      auVar316[0xe] = (0 < sVar71) * (sVar71 < 0x100) * auVar238[0xc] - (0xff < sVar71);
      auVar316._0_14_ = auVar309;
      sVar71 = auVar238._14_2_;
      cVar39 = (0 < sVar71) * (sVar71 < 0x100) * auVar238[0xe] - (0xff < sVar71);
      auVar316[0xf] = cVar39;
      auVar238 = auVar342 & auVar220;
      auVar283 = auVar244 & auVar220;
      sVar71 = auVar238._0_2_;
      sVar72 = auVar238._2_2_;
      bVar37 = (0 < sVar72) * (sVar72 < 0x100) * auVar238[2] - (0xff < sVar72);
      sVar72 = auVar238._4_2_;
      sVar76 = auVar238._6_2_;
      cVar52 = (0 < sVar76) * (sVar76 < 0x100) * auVar238[6] - (0xff < sVar76);
      uVar271 = CONCAT13(cVar52,CONCAT12((0 < sVar72) * (sVar72 < 0x100) * auVar238[4] -
                                         (0xff < sVar72),
                                         CONCAT11(bVar37,(0 < sVar71) * (sVar71 < 0x100) *
                                                         auVar238[0] - (0xff < sVar71))));
      sVar71 = auVar238._8_2_;
      sVar72 = auVar238._10_2_;
      cVar48 = (0 < sVar72) * (sVar72 < 0x100) * auVar238[10] - (0xff < sVar72);
      uVar272 = CONCAT15(cVar48,CONCAT14((0 < sVar71) * (sVar71 < 0x100) * auVar238[8] -
                                         (0xff < sVar71),uVar271));
      sVar71 = auVar238._12_2_;
      sVar72 = auVar238._14_2_;
      cVar44 = (0 < sVar72) * (sVar72 < 0x100) * auVar238[0xe] - (0xff < sVar72);
      uVar273 = CONCAT17(cVar44,CONCAT16((0 < sVar71) * (sVar71 < 0x100) * auVar238[0xc] -
                                         (0xff < sVar71),uVar272));
      sVar71 = auVar283._0_2_;
      sVar72 = auVar283._2_2_;
      cVar43 = (0 < sVar72) * (sVar72 < 0x100) * auVar283[2] - (0xff < sVar72);
      auVar277._0_10_ =
           CONCAT19(cVar43,CONCAT18((0 < sVar71) * (sVar71 < 0x100) * auVar283[0] - (0xff < sVar71),
                                    uVar273));
      sVar71 = auVar283._4_2_;
      auVar277[10] = (0 < sVar71) * (sVar71 < 0x100) * auVar283[4] - (0xff < sVar71);
      sVar71 = auVar283._6_2_;
      cVar40 = (0 < sVar71) * (sVar71 < 0x100) * auVar283[6] - (0xff < sVar71);
      auVar277[0xb] = cVar40;
      sVar71 = auVar283._8_2_;
      auVar281[0xc] = (0 < sVar71) * (sVar71 < 0x100) * auVar283[8] - (0xff < sVar71);
      auVar281._0_12_ = auVar277;
      sVar71 = auVar283._10_2_;
      cVar42 = (0 < sVar71) * (sVar71 < 0x100) * auVar283[10] - (0xff < sVar71);
      auVar281[0xd] = cVar42;
      sVar71 = auVar283._12_2_;
      auVar289[0xe] = (0 < sVar71) * (sVar71 < 0x100) * auVar283[0xc] - (0xff < sVar71);
      auVar289._0_14_ = auVar281;
      sVar71 = auVar283._14_2_;
      cVar41 = (0 < sVar71) * (sVar71 < 0x100) * auVar283[0xe] - (0xff < sVar71);
      auVar289[0xf] = cVar41;
      auVar283 = auVar400 & auVar220;
      auVar238 = auVar425 & auVar220;
      sVar71 = auVar283._0_2_;
      sVar72 = auVar283._2_2_;
      bVar45 = (0 < sVar72) * (sVar72 < 0x100) * auVar283[2] - (0xff < sVar72);
      sVar72 = auVar283._4_2_;
      sVar76 = auVar283._6_2_;
      cVar51 = (0 < sVar76) * (sVar76 < 0x100) * auVar283[6] - (0xff < sVar76);
      uVar359 = CONCAT13(cVar51,CONCAT12((0 < sVar72) * (sVar72 < 0x100) * auVar283[4] -
                                         (0xff < sVar72),
                                         CONCAT11(bVar45,(0 < sVar71) * (sVar71 < 0x100) *
                                                         auVar283[0] - (0xff < sVar71))));
      sVar71 = auVar283._8_2_;
      sVar72 = auVar283._10_2_;
      cVar50 = (0 < sVar72) * (sVar72 < 0x100) * auVar283[10] - (0xff < sVar72);
      uVar360 = CONCAT15(cVar50,CONCAT14((0 < sVar71) * (sVar71 < 0x100) * auVar283[8] -
                                         (0xff < sVar71),uVar359));
      sVar71 = auVar283._12_2_;
      sVar72 = auVar283._14_2_;
      cVar49 = (0 < sVar72) * (sVar72 < 0x100) * auVar283[0xe] - (0xff < sVar72);
      uVar361 = CONCAT17(cVar49,CONCAT16((0 < sVar71) * (sVar71 < 0x100) * auVar283[0xc] -
                                         (0xff < sVar71),uVar360));
      sVar71 = auVar238._0_2_;
      sVar72 = auVar238._2_2_;
      cVar47 = (0 < sVar72) * (sVar72 < 0x100) * auVar238[2] - (0xff < sVar72);
      auVar364._0_10_ =
           CONCAT19(cVar47,CONCAT18((0 < sVar71) * (sVar71 < 0x100) * auVar238[0] - (0xff < sVar71),
                                    uVar361));
      sVar71 = auVar238._4_2_;
      auVar364[10] = (0 < sVar71) * (sVar71 < 0x100) * auVar238[4] - (0xff < sVar71);
      sVar71 = auVar238._6_2_;
      cVar46 = (0 < sVar71) * (sVar71 < 0x100) * auVar238[6] - (0xff < sVar71);
      auVar364[0xb] = cVar46;
      sVar71 = auVar238._8_2_;
      auVar367[0xc] = (0 < sVar71) * (sVar71 < 0x100) * auVar238[8] - (0xff < sVar71);
      auVar367._0_12_ = auVar364;
      sVar71 = auVar238._10_2_;
      cVar54 = (0 < sVar71) * (sVar71 < 0x100) * auVar238[10] - (0xff < sVar71);
      auVar367[0xd] = cVar54;
      sVar71 = auVar238._12_2_;
      auVar375[0xe] = (0 < sVar71) * (sVar71 < 0x100) * auVar238[0xc] - (0xff < sVar71);
      auVar375._0_14_ = auVar367;
      sVar71 = auVar238._14_2_;
      cVar55 = (0 < sVar71) * (sVar71 < 0x100) * auVar238[0xe] - (0xff < sVar71);
      auVar375[0xf] = cVar55;
      uVar228 = (ushort)bVar248;
      uVar247 = (ushort)((uint)uVar255 >> 0x18);
      uVar249 = (ushort)((uint6)uVar256 >> 0x28);
      uVar250 = (ushort)((ulong)uVar257 >> 0x38);
      uVar251 = (ushort)((unkuint10)auVar260._0_10_ >> 0x48);
      uVar252 = auVar260._10_2_ >> 8;
      uVar253 = auVar264._12_2_ >> 8;
      uVar254 = auVar269._14_2_ >> 8;
      uVar324 = (ushort)bVar7;
      uVar344 = (ushort)((uint)uVar290 >> 0x18);
      uVar346 = (ushort)((uint6)uVar291 >> 0x28);
      uVar348 = (ushort)((ulong)uVar292 >> 0x38);
      uVar350 = (ushort)((unkuint10)auVar293._0_10_ >> 0x48);
      uVar352 = auVar293._10_2_ >> 8;
      uVar354 = auVar294._12_2_ >> 8;
      uVar356 = auVar298._14_2_ >> 8;
      bVar53 = (uVar247 != 0) * (uVar247 < 0x100) * cVar10 - (0xff < uVar247);
      cVar56 = (uVar250 != 0) * (uVar250 < 0x100) * cVar13 - (0xff < uVar250);
      uVar255 = CONCAT13(cVar56,CONCAT12((uVar249 != 0) * (uVar249 < 0x100) * cVar11 -
                                         (0xff < uVar249),
                                         CONCAT11(bVar53,(uVar228 != 0) * (uVar228 < 0x100) *
                                                         bVar248 - (0xff < uVar228))));
      cVar19 = (uVar252 != 0) * (uVar252 < 0x100) * cVar19 - (0xff < uVar252);
      uVar256 = CONCAT15(cVar19,CONCAT14((uVar251 != 0) * (uVar251 < 0x100) * cVar14 -
                                         (0xff < uVar251),uVar255));
      cVar10 = (uVar254 != 0) * (uVar254 < 0x100) * cVar21 - (0xff < uVar254);
      uVar257 = CONCAT17(cVar10,CONCAT16((uVar253 != 0) * (uVar253 < 0x100) * cVar22 -
                                         (0xff < uVar253),uVar256));
      cVar22 = (uVar344 != 0) * (uVar344 < 0x100) * cVar60 - (0xff < uVar344);
      auVar261._0_10_ =
           CONCAT19(cVar22,CONCAT18((uVar324 != 0) * (uVar324 < 0x100) * bVar7 - (0xff < uVar324),
                                    uVar257));
      auVar261[10] = (uVar346 != 0) * (uVar346 < 0x100) * cVar59 - (0xff < uVar346);
      cVar14 = (uVar348 != 0) * (uVar348 < 0x100) * cVar58 - (0xff < uVar348);
      auVar261[0xb] = cVar14;
      auVar265[0xc] = (uVar350 != 0) * (uVar350 < 0x100) * cVar20 - (0xff < uVar350);
      auVar265._0_12_ = auVar261;
      cVar13 = (uVar352 != 0) * (uVar352 < 0x100) * cVar57 - (0xff < uVar352);
      auVar265[0xd] = cVar13;
      auVar270[0xe] = (uVar354 != 0) * (uVar354 < 0x100) * cVar299 - (0xff < uVar354);
      auVar270._0_14_ = auVar265;
      cVar11 = (uVar356 != 0) * (uVar356 < 0x100) * cVar18 - (0xff < uVar356);
      auVar270[0xf] = cVar11;
      uVar324 = (ushort)bVar61;
      uVar344 = (ushort)((uint)uVar326 >> 0x18);
      uVar346 = (ushort)((uint6)uVar327 >> 0x28);
      uVar348 = (ushort)((ulong)uVar328 >> 0x38);
      uVar350 = (ushort)((unkuint10)auVar331._0_10_ >> 0x48);
      uVar352 = auVar331._10_2_ >> 8;
      uVar354 = auVar335._12_2_ >> 8;
      uVar356 = auVar342._14_2_ >> 8;
      uVar228 = (ushort)bVar69;
      uVar247 = (ushort)((uint)uVar229 >> 0x18);
      uVar249 = (ushort)((uint6)uVar230 >> 0x28);
      uVar250 = (ushort)((ulong)uVar231 >> 0x38);
      uVar251 = (ushort)((unkuint10)auVar234._0_10_ >> 0x48);
      uVar252 = auVar234._10_2_ >> 8;
      uVar253 = auVar237._12_2_ >> 8;
      uVar254 = auVar244._14_2_ >> 8;
      bVar248 = (uVar344 != 0) * (uVar344 < 0x100) * cVar66 - (0xff < uVar344);
      cVar21 = (uVar348 != 0) * (uVar348 < 0x100) * cVar68 - (0xff < uVar348);
      uVar229 = CONCAT13(cVar21,CONCAT12((uVar346 != 0) * (uVar346 < 0x100) * cVar67 -
                                         (0xff < uVar346),
                                         CONCAT11(bVar248,(uVar324 != 0) * (uVar324 < 0x100) *
                                                          bVar61 - (0xff < uVar324))));
      cVar20 = (uVar352 != 0) * (uVar352 < 0x100) * cVar64 - (0xff < uVar352);
      uVar230 = CONCAT15(cVar20,CONCAT14((uVar350 != 0) * (uVar350 < 0x100) * cVar62 -
                                         (0xff < uVar350),uVar229));
      cVar18 = (uVar356 != 0) * (uVar356 < 0x100) * cVar65 - (0xff < uVar356);
      uVar231 = CONCAT17(cVar18,CONCAT16((uVar354 != 0) * (uVar354 < 0x100) * cVar63 -
                                         (0xff < uVar354),uVar230));
      cVar299 = (uVar247 != 0) * (uVar247 < 0x100) * cVar70 - (0xff < uVar247);
      auVar332._0_10_ =
           CONCAT19(cVar299,CONCAT18((uVar228 != 0) * (uVar228 < 0x100) * bVar69 - (0xff < uVar228),
                                     uVar231));
      auVar332[10] = (uVar249 != 0) * (uVar249 < 0x100) * cVar27 - (0xff < uVar249);
      cVar26 = (uVar250 != 0) * (uVar250 < 0x100) * cVar26 - (0xff < uVar250);
      auVar332[0xb] = cVar26;
      auVar336[0xc] = (uVar251 != 0) * (uVar251 < 0x100) * cVar25 - (0xff < uVar251);
      auVar336._0_12_ = auVar332;
      cVar17 = (uVar252 != 0) * (uVar252 < 0x100) * cVar17 - (0xff < uVar252);
      auVar336[0xd] = cVar17;
      auVar343[0xe] = (uVar253 != 0) * (uVar253 < 0x100) * cVar24 - (0xff < uVar253);
      auVar343._0_14_ = auVar336;
      cVar16 = (uVar254 != 0) * (uVar254 < 0x100) * cVar16 - (0xff < uVar254);
      auVar343[0xf] = cVar16;
      uVar228 = (ushort)bVar15;
      uVar247 = (ushort)((uint)uVar384 >> 0x18);
      uVar249 = (ushort)((uint6)uVar385 >> 0x28);
      uVar250 = (ushort)((ulong)uVar386 >> 0x38);
      uVar251 = (ushort)((unkuint10)auVar389._0_10_ >> 0x48);
      uVar252 = auVar389._10_2_ >> 8;
      uVar253 = auVar393._12_2_ >> 8;
      uVar254 = auVar400._14_2_ >> 8;
      uVar324 = (ushort)bVar300;
      uVar344 = (ushort)((uint)uVar409 >> 0x18);
      uVar346 = (ushort)((uint6)uVar410 >> 0x28);
      uVar348 = (ushort)((ulong)uVar411 >> 0x38);
      uVar350 = (ushort)((unkuint10)auVar414._0_10_ >> 0x48);
      uVar352 = auVar414._10_2_ >> 8;
      uVar354 = auVar417._12_2_ >> 8;
      uVar356 = auVar425._14_2_ >> 8;
      bVar7 = (uVar247 != 0) * (uVar247 < 0x100) * cVar28 - (0xff < uVar247);
      cVar36 = (uVar250 != 0) * (uVar250 < 0x100) * cVar36 - (0xff < uVar250);
      uVar290 = CONCAT13(cVar36,CONCAT12((uVar249 != 0) * (uVar249 < 0x100) * cVar34 -
                                         (0xff < uVar249),
                                         CONCAT11(bVar7,(uVar228 != 0) * (uVar228 < 0x100) * bVar15
                                                        - (0xff < uVar228))));
      cVar28 = (uVar252 != 0) * (uVar252 < 0x100) * cVar33 - (0xff < uVar252);
      uVar291 = CONCAT15(cVar28,CONCAT14((uVar251 != 0) * (uVar251 < 0x100) * cVar35 -
                                         (0xff < uVar251),uVar290));
      cVar24 = (uVar254 != 0) * (uVar254 < 0x100) * cVar31 - (0xff < uVar254);
      uVar292 = CONCAT17(cVar24,CONCAT16((uVar253 != 0) * (uVar253 < 0x100) * cVar32 -
                                         (0xff < uVar253),uVar291));
      cVar27 = (uVar344 != 0) * (uVar344 < 0x100) * cVar38 - (0xff < uVar344);
      auVar390._0_10_ =
           CONCAT19(cVar27,CONCAT18((uVar324 != 0) * (uVar324 < 0x100) * bVar300 - (0xff < uVar324),
                                    uVar292));
      auVar390[10] = (uVar346 != 0) * (uVar346 < 0x100) * cVar30 - (0xff < uVar346);
      cVar25 = (uVar348 != 0) * (uVar348 < 0x100) * cVar246 - (0xff < uVar348);
      auVar390[0xb] = cVar25;
      auVar394[0xc] = (uVar350 != 0) * (uVar350 < 0x100) * cVar23 - (0xff < uVar350);
      auVar394._0_12_ = auVar390;
      cVar5 = (uVar352 != 0) * (uVar352 < 0x100) * cVar5 - (0xff < uVar352);
      auVar394[0xd] = cVar5;
      auVar401[0xe] = (uVar354 != 0) * (uVar354 < 0x100) * cVar6 - (0xff < uVar354);
      auVar401._0_14_ = auVar394;
      cVar246 = (uVar356 != 0) * (uVar356 < 0x100) * cVar1 - (0xff < uVar356);
      auVar401[0xf] = cVar246;
      auVar238 = auVar316 & auVar220;
      auVar283 = auVar289 & auVar220;
      sVar71 = auVar238._0_2_;
      sVar76 = auVar238._2_2_;
      sVar74 = auVar238._4_2_;
      sVar77 = auVar238._6_2_;
      sVar79 = auVar238._8_2_;
      sVar81 = auVar238._10_2_;
      sVar83 = auVar238._12_2_;
      sVar85 = auVar238._14_2_;
      sVar87 = auVar283._0_2_;
      sVar89 = auVar283._2_2_;
      sVar91 = auVar283._4_2_;
      sVar93 = auVar283._6_2_;
      sVar95 = auVar283._8_2_;
      sVar97 = auVar283._10_2_;
      sVar99 = auVar283._12_2_;
      sVar101 = auVar283._14_2_;
      auVar338 = auVar375 & auVar220;
      auVar339 = auVar270 & auVar220;
      sVar72 = auVar338._0_2_;
      sVar73 = auVar338._2_2_;
      in_XMM4[1] = (0 < sVar73) * (sVar73 < 0x100) * auVar338[2] - (0xff < sVar73);
      in_XMM4[0] = (0 < sVar72) * (sVar72 < 0x100) * auVar338[0] - (0xff < sVar72);
      sVar72 = auVar338._4_2_;
      in_XMM4[2] = (0 < sVar72) * (sVar72 < 0x100) * auVar338[4] - (0xff < sVar72);
      sVar72 = auVar338._6_2_;
      in_XMM4[3] = (0 < sVar72) * (sVar72 < 0x100) * auVar338[6] - (0xff < sVar72);
      sVar72 = auVar338._8_2_;
      in_XMM4[4] = (0 < sVar72) * (sVar72 < 0x100) * auVar338[8] - (0xff < sVar72);
      sVar72 = auVar338._10_2_;
      in_XMM4[5] = (0 < sVar72) * (sVar72 < 0x100) * auVar338[10] - (0xff < sVar72);
      sVar72 = auVar338._12_2_;
      in_XMM4[6] = (0 < sVar72) * (sVar72 < 0x100) * auVar338[0xc] - (0xff < sVar72);
      sVar72 = auVar338._14_2_;
      in_XMM4[7] = (0 < sVar72) * (sVar72 < 0x100) * auVar338[0xe] - (0xff < sVar72);
      sVar72 = auVar339._0_2_;
      in_XMM4[8] = (0 < sVar72) * (sVar72 < 0x100) * auVar339[0] - (0xff < sVar72);
      sVar72 = auVar339._2_2_;
      in_XMM4[9] = (0 < sVar72) * (sVar72 < 0x100) * auVar339[2] - (0xff < sVar72);
      sVar72 = auVar339._4_2_;
      in_XMM4[10] = (0 < sVar72) * (sVar72 < 0x100) * auVar339[4] - (0xff < sVar72);
      sVar72 = auVar339._6_2_;
      in_XMM4[0xb] = (0 < sVar72) * (sVar72 < 0x100) * auVar339[6] - (0xff < sVar72);
      sVar72 = auVar339._8_2_;
      in_XMM4[0xc] = (0 < sVar72) * (sVar72 < 0x100) * auVar339[8] - (0xff < sVar72);
      sVar72 = auVar339._10_2_;
      in_XMM4[0xd] = (0 < sVar72) * (sVar72 < 0x100) * auVar339[10] - (0xff < sVar72);
      sVar72 = auVar339._12_2_;
      in_XMM4[0xe] = (0 < sVar72) * (sVar72 < 0x100) * auVar339[0xc] - (0xff < sVar72);
      sVar72 = auVar339._14_2_;
      in_XMM4[0xf] = (0 < sVar72) * (sVar72 < 0x100) * auVar339[0xe] - (0xff < sVar72);
      auVar338 = auVar343 & auVar220;
      auVar339 = auVar401 & auVar220;
      sVar72 = auVar338._0_2_;
      sVar73 = auVar338._2_2_;
      sVar75 = auVar338._4_2_;
      sVar78 = auVar338._6_2_;
      sVar80 = auVar338._8_2_;
      sVar82 = auVar338._10_2_;
      sVar84 = auVar338._12_2_;
      sVar86 = auVar338._14_2_;
      sVar88 = auVar339._0_2_;
      sVar90 = auVar339._2_2_;
      sVar92 = auVar339._4_2_;
      sVar94 = auVar339._6_2_;
      sVar96 = auVar339._8_2_;
      sVar98 = auVar339._10_2_;
      sVar100 = auVar339._12_2_;
      sVar102 = auVar339._14_2_;
      uVar302 = (ushort)bVar29;
      uVar317 = (ushort)((uint)uVar303 >> 0x18);
      uVar318 = (ushort)((uint6)uVar304 >> 0x28);
      uVar319 = (ushort)((ulong)uVar305 >> 0x38);
      uVar320 = (ushort)((unkuint10)auVar307._0_10_ >> 0x48);
      uVar321 = auVar307._10_2_ >> 8;
      uVar322 = auVar309._12_2_ >> 8;
      uVar323 = auVar316._14_2_ >> 8;
      uVar324 = (ushort)bVar37;
      uVar344 = (ushort)((uint)uVar271 >> 0x18);
      uVar346 = (ushort)((uint6)uVar272 >> 0x28);
      uVar348 = (ushort)((ulong)uVar273 >> 0x38);
      uVar350 = (ushort)((unkuint10)auVar277._0_10_ >> 0x48);
      uVar352 = auVar277._10_2_ >> 8;
      uVar354 = auVar281._12_2_ >> 8;
      uVar356 = auVar289._14_2_ >> 8;
      uVar358 = (ushort)bVar45;
      uVar376 = (ushort)((uint)uVar359 >> 0x18);
      uVar377 = (ushort)((uint6)uVar360 >> 0x28);
      uVar378 = (ushort)((ulong)uVar361 >> 0x38);
      uVar379 = (ushort)((unkuint10)auVar364._0_10_ >> 0x48);
      uVar380 = auVar364._10_2_ >> 8;
      uVar381 = auVar367._12_2_ >> 8;
      uVar382 = auVar375._14_2_ >> 8;
      uVar228 = (ushort)bVar53;
      uVar247 = (ushort)((uint)uVar255 >> 0x18);
      uVar249 = (ushort)((uint6)uVar256 >> 0x28);
      uVar250 = (ushort)((ulong)uVar257 >> 0x38);
      uVar251 = (ushort)((unkuint10)auVar261._0_10_ >> 0x48);
      uVar252 = auVar261._10_2_ >> 8;
      uVar253 = auVar265._12_2_ >> 8;
      uVar254 = auVar270._14_2_ >> 8;
      uVar325 = (ushort)bVar248;
      uVar345 = (ushort)((uint)uVar229 >> 0x18);
      uVar347 = (ushort)((uint6)uVar230 >> 0x28);
      uVar349 = (ushort)((ulong)uVar231 >> 0x38);
      uVar351 = (ushort)((unkuint10)auVar332._0_10_ >> 0x48);
      uVar353 = auVar332._10_2_ >> 8;
      uVar355 = auVar336._12_2_ >> 8;
      uVar357 = auVar343._14_2_ >> 8;
      uVar383 = (ushort)bVar7;
      uVar402 = (ushort)((uint)uVar290 >> 0x18);
      uVar403 = (ushort)((uint6)uVar291 >> 0x28);
      uVar404 = (ushort)((ulong)uVar292 >> 0x38);
      uVar405 = (ushort)((unkuint10)auVar390._0_10_ >> 0x48);
      uVar406 = auVar390._10_2_ >> 8;
      uVar407 = auVar394._12_2_ >> 8;
      uVar408 = auVar401._14_2_ >> 8;
      in_XMM11[1] = (uVar345 != 0) * (uVar345 < 0x100) * cVar21 - (0xff < uVar345);
      in_XMM11[0] = (uVar325 != 0) * (uVar325 < 0x100) * bVar248 - (0xff < uVar325);
      in_XMM11[2] = (uVar347 != 0) * (uVar347 < 0x100) * cVar20 - (0xff < uVar347);
      in_XMM11[3] = (uVar349 != 0) * (uVar349 < 0x100) * cVar18 - (0xff < uVar349);
      in_XMM11[4] = (uVar351 != 0) * (uVar351 < 0x100) * cVar299 - (0xff < uVar351);
      in_XMM11[5] = (uVar353 != 0) * (uVar353 < 0x100) * cVar26 - (0xff < uVar353);
      in_XMM11[6] = (uVar355 != 0) * (uVar355 < 0x100) * cVar17 - (0xff < uVar355);
      in_XMM11[7] = (uVar357 != 0) * (uVar357 < 0x100) * cVar16 - (0xff < uVar357);
      in_XMM11[8] = (uVar383 != 0) * (uVar383 < 0x100) * bVar7 - (0xff < uVar383);
      in_XMM11[9] = (uVar402 != 0) * (uVar402 < 0x100) * cVar36 - (0xff < uVar402);
      in_XMM11[10] = (uVar403 != 0) * (uVar403 < 0x100) * cVar28 - (0xff < uVar403);
      in_XMM11[0xb] = (uVar404 != 0) * (uVar404 < 0x100) * cVar24 - (0xff < uVar404);
      in_XMM11[0xc] = (uVar405 != 0) * (uVar405 < 0x100) * cVar27 - (0xff < uVar405);
      in_XMM11[0xd] = (uVar406 != 0) * (uVar406 < 0x100) * cVar25 - (0xff < uVar406);
      in_XMM11[0xe] = (uVar407 != 0) * (uVar407 < 0x100) * cVar5 - (0xff < uVar407);
      in_XMM11[0xf] = (uVar408 != 0) * (uVar408 < 0x100) * cVar246 - (0xff < uVar408);
      *dst = (0 < sVar71) * (sVar71 < 0x100) * auVar238[0] - (0xff < sVar71);
      dst[1] = (0 < sVar76) * (sVar76 < 0x100) * auVar238[2] - (0xff < sVar76);
      dst[2] = (0 < sVar74) * (sVar74 < 0x100) * auVar238[4] - (0xff < sVar74);
      dst[3] = (0 < sVar77) * (sVar77 < 0x100) * auVar238[6] - (0xff < sVar77);
      dst[4] = (0 < sVar79) * (sVar79 < 0x100) * auVar238[8] - (0xff < sVar79);
      dst[5] = (0 < sVar81) * (sVar81 < 0x100) * auVar238[10] - (0xff < sVar81);
      dst[6] = (0 < sVar83) * (sVar83 < 0x100) * auVar238[0xc] - (0xff < sVar83);
      dst[7] = (0 < sVar85) * (sVar85 < 0x100) * auVar238[0xe] - (0xff < sVar85);
      dst[8] = (0 < sVar87) * (sVar87 < 0x100) * auVar283[0] - (0xff < sVar87);
      dst[9] = (0 < sVar89) * (sVar89 < 0x100) * auVar283[2] - (0xff < sVar89);
      dst[10] = (0 < sVar91) * (sVar91 < 0x100) * auVar283[4] - (0xff < sVar91);
      dst[0xb] = (0 < sVar93) * (sVar93 < 0x100) * auVar283[6] - (0xff < sVar93);
      dst[0xc] = (0 < sVar95) * (sVar95 < 0x100) * auVar283[8] - (0xff < sVar95);
      dst[0xd] = (0 < sVar97) * (sVar97 < 0x100) * auVar283[10] - (0xff < sVar97);
      dst[0xe] = (0 < sVar99) * (sVar99 < 0x100) * auVar283[0xc] - (0xff < sVar99);
      dst[0xf] = (0 < sVar101) * (sVar101 < 0x100) * auVar283[0xe] - (0xff < sVar101);
      *(undefined1 (*) [16])(dst + 0x10) = in_XMM4;
      dst[0x20] = (0 < sVar72) * (sVar72 < 0x100) * auVar338[0] - (0xff < sVar72);
      dst[0x21] = (0 < sVar73) * (sVar73 < 0x100) * auVar338[2] - (0xff < sVar73);
      dst[0x22] = (0 < sVar75) * (sVar75 < 0x100) * auVar338[4] - (0xff < sVar75);
      dst[0x23] = (0 < sVar78) * (sVar78 < 0x100) * auVar338[6] - (0xff < sVar78);
      dst[0x24] = (0 < sVar80) * (sVar80 < 0x100) * auVar338[8] - (0xff < sVar80);
      dst[0x25] = (0 < sVar82) * (sVar82 < 0x100) * auVar338[10] - (0xff < sVar82);
      dst[0x26] = (0 < sVar84) * (sVar84 < 0x100) * auVar338[0xc] - (0xff < sVar84);
      dst[0x27] = (0 < sVar86) * (sVar86 < 0x100) * auVar338[0xe] - (0xff < sVar86);
      dst[0x28] = (0 < sVar88) * (sVar88 < 0x100) * auVar339[0] - (0xff < sVar88);
      dst[0x29] = (0 < sVar90) * (sVar90 < 0x100) * auVar339[2] - (0xff < sVar90);
      dst[0x2a] = (0 < sVar92) * (sVar92 < 0x100) * auVar339[4] - (0xff < sVar92);
      dst[0x2b] = (0 < sVar94) * (sVar94 < 0x100) * auVar339[6] - (0xff < sVar94);
      dst[0x2c] = (0 < sVar96) * (sVar96 < 0x100) * auVar339[8] - (0xff < sVar96);
      dst[0x2d] = (0 < sVar98) * (sVar98 < 0x100) * auVar339[10] - (0xff < sVar98);
      dst[0x2e] = (0 < sVar100) * (sVar100 < 0x100) * auVar339[0xc] - (0xff < sVar100);
      dst[0x2f] = (0 < sVar102) * (sVar102 < 0x100) * auVar339[0xe] - (0xff < sVar102);
      dst[0x30] = (uVar302 != 0) * (uVar302 < 0x100) * bVar29 - (0xff < uVar302);
      dst[0x31] = (uVar317 != 0) * (uVar317 < 0x100) * cVar3 - (0xff < uVar317);
      dst[0x32] = (uVar318 != 0) * (uVar318 < 0x100) * cVar2 - (0xff < uVar318);
      dst[0x33] = (uVar319 != 0) * (uVar319 < 0x100) * cVar4 - (0xff < uVar319);
      dst[0x34] = (uVar320 != 0) * (uVar320 < 0x100) * cVar8 - (0xff < uVar320);
      dst[0x35] = (uVar321 != 0) * (uVar321 < 0x100) * cVar9 - (0xff < uVar321);
      dst[0x36] = (uVar322 != 0) * (uVar322 < 0x100) * cVar12 - (0xff < uVar322);
      dst[0x37] = (uVar323 != 0) * (uVar323 < 0x100) * cVar39 - (0xff < uVar323);
      dst[0x38] = (uVar324 != 0) * (uVar324 < 0x100) * bVar37 - (0xff < uVar324);
      dst[0x39] = (uVar344 != 0) * (uVar344 < 0x100) * cVar52 - (0xff < uVar344);
      dst[0x3a] = (uVar346 != 0) * (uVar346 < 0x100) * cVar48 - (0xff < uVar346);
      dst[0x3b] = (uVar348 != 0) * (uVar348 < 0x100) * cVar44 - (0xff < uVar348);
      dst[0x3c] = (uVar350 != 0) * (uVar350 < 0x100) * cVar43 - (0xff < uVar350);
      dst[0x3d] = (uVar352 != 0) * (uVar352 < 0x100) * cVar40 - (0xff < uVar352);
      dst[0x3e] = (uVar354 != 0) * (uVar354 < 0x100) * cVar42 - (0xff < uVar354);
      dst[0x3f] = (uVar356 != 0) * (uVar356 < 0x100) * cVar41 - (0xff < uVar356);
      dst[0x40] = (uVar358 != 0) * (uVar358 < 0x100) * bVar45 - (0xff < uVar358);
      dst[0x41] = (uVar376 != 0) * (uVar376 < 0x100) * cVar51 - (0xff < uVar376);
      dst[0x42] = (uVar377 != 0) * (uVar377 < 0x100) * cVar50 - (0xff < uVar377);
      dst[0x43] = (uVar378 != 0) * (uVar378 < 0x100) * cVar49 - (0xff < uVar378);
      dst[0x44] = (uVar379 != 0) * (uVar379 < 0x100) * cVar47 - (0xff < uVar379);
      dst[0x45] = (uVar380 != 0) * (uVar380 < 0x100) * cVar46 - (0xff < uVar380);
      dst[0x46] = (uVar381 != 0) * (uVar381 < 0x100) * cVar54 - (0xff < uVar381);
      dst[0x47] = (uVar382 != 0) * (uVar382 < 0x100) * cVar55 - (0xff < uVar382);
      dst[0x48] = (uVar228 != 0) * (uVar228 < 0x100) * bVar53 - (0xff < uVar228);
      dst[0x49] = (uVar247 != 0) * (uVar247 < 0x100) * cVar56 - (0xff < uVar247);
      dst[0x4a] = (uVar249 != 0) * (uVar249 < 0x100) * cVar19 - (0xff < uVar249);
      dst[0x4b] = (uVar250 != 0) * (uVar250 < 0x100) * cVar10 - (0xff < uVar250);
      dst[0x4c] = (uVar251 != 0) * (uVar251 < 0x100) * cVar22 - (0xff < uVar251);
      dst[0x4d] = (uVar252 != 0) * (uVar252 < 0x100) * cVar14 - (0xff < uVar252);
      dst[0x4e] = (uVar253 != 0) * (uVar253 < 0x100) * cVar13 - (0xff < uVar253);
      dst[0x4f] = (uVar254 != 0) * (uVar254 < 0x100) * cVar11 - (0xff < uVar254);
      *(undefined1 (*) [16])(dst + 0x50) = in_XMM11;
      y = y + 0x20;
      u = u + 0x10;
      v = v + 0x10;
      dst = dst + 0x60;
      iVar226 = iVar226 + 0x20;
    } while (iVar226 <= len);
  }
  if ((int)uVar221 < len) {
    do {
      bVar248 = *u;
      uVar227 = (uint)*y * 0x4a85 >> 8;
      uVar224 = ((uint)*v * 0x6625 >> 8) + uVar227;
      uVar225 = uVar224 - 0x379a;
      uVar223 = (uVar224 < 0x379a) + 0xff;
      if (uVar225 < 0x4000) {
        uVar223 = (uint8_t)(uVar225 >> 6);
      }
      iVar226 = ((uint)*v * 0x3408 >> 8) + ((uint)bVar248 * 0x1913 >> 8);
      uVar224 = (uVar227 - iVar226) + 0x2204;
      uVar222 = -(-0x2205 < (int)(uVar227 - iVar226));
      if (uVar224 < 0x4000) {
        uVar222 = (uint8_t)(uVar224 >> 6);
      }
      *dst = uVar223;
      uVar227 = ((uint)bVar248 * 0x811a >> 8) + uVar227;
      uVar224 = uVar227 - 0x4515;
      dst[1] = uVar222;
      uVar223 = (uVar227 < 0x4515) + 0xff;
      if (uVar224 < 0x4000) {
        uVar223 = (uint8_t)(uVar224 >> 6);
      }
      dst[2] = uVar223;
      y = y + 1;
      u = u + (uVar221 & 1);
      v = v + (uVar221 & 1);
      uVar221 = uVar221 + 1;
      dst = dst + 3;
    } while (len != uVar221);
  }
  return;
}

Assistant:

static void YuvToRgbRow_SSE2(const uint8_t* WEBP_RESTRICT y,
                             const uint8_t* WEBP_RESTRICT u,
                             const uint8_t* WEBP_RESTRICT v,
                             uint8_t* WEBP_RESTRICT dst, int len) {
  int n;
  for (n = 0; n + 32 <= len; n += 32, dst += 32 * 3) {
    __m128i R0, R1, R2, R3, G0, G1, G2, G3, B0, B1, B2, B3;
    __m128i rgb0, rgb1, rgb2, rgb3, rgb4, rgb5;

    YUV420ToRGB_SSE2(y +  0, u +  0, v +  0, &R0, &G0, &B0);
    YUV420ToRGB_SSE2(y +  8, u +  4, v +  4, &R1, &G1, &B1);
    YUV420ToRGB_SSE2(y + 16, u +  8, v +  8, &R2, &G2, &B2);
    YUV420ToRGB_SSE2(y + 24, u + 12, v + 12, &R3, &G3, &B3);

    // Cast to 8b and store as RRRRGGGGBBBB.
    rgb0 = _mm_packus_epi16(R0, R1);
    rgb1 = _mm_packus_epi16(R2, R3);
    rgb2 = _mm_packus_epi16(G0, G1);
    rgb3 = _mm_packus_epi16(G2, G3);
    rgb4 = _mm_packus_epi16(B0, B1);
    rgb5 = _mm_packus_epi16(B2, B3);

    // Pack as RGBRGBRGBRGB.
    PlanarTo24b_SSE2(&rgb0, &rgb1, &rgb2, &rgb3, &rgb4, &rgb5, dst);

    y += 32;
    u += 16;
    v += 16;
  }
  for (; n < len; ++n) {   // Finish off
    VP8YuvToRgb(y[0], u[0], v[0], dst);
    dst += 3;
    y += 1;
    u += (n & 1);
    v += (n & 1);
  }
}